

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  byte bVar35;
  uint uVar36;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float t1;
  undefined4 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  vfloat4 b0;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vfloat4 b0_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  vfloat4 a0_3;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vfloat4 a0_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar201;
  float fVar211;
  float fVar213;
  float fVar215;
  undefined1 auVar202 [16];
  float fVar212;
  float fVar214;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar216;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  vfloat4 a0;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  vfloat4 a0_1;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar37;
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  
  PVar7 = prim[1];
  uVar39 = (ulong)(byte)PVar7;
  fVar124 = *(float *)(prim + uVar39 * 0x19 + 0x12);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar46 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar49 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar47 = vsubps_avx(auVar46,*(undefined1 (*) [16])(prim + uVar39 * 0x19 + 6));
  fVar123 = fVar124 * auVar47._0_4_;
  fVar106 = fVar124 * auVar49._0_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar39 * 4 + 6);
  auVar77 = vpmovsxbd_avx2(auVar46);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar39 * 5 + 6);
  auVar75 = vpmovsxbd_avx2(auVar58);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar39 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar4);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar39 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar57);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar81 = vpmovsxbd_avx2(auVar56);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar81);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar39 + 6);
  auVar76 = vpmovsxbd_avx2(auVar55);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar38 = (ulong)(uint)((int)(uVar39 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar38 + 6);
  auVar78 = vpmovsxbd_avx2(auVar5);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar38 + uVar39 + 6);
  auVar79 = vpmovsxbd_avx2(auVar54);
  auVar79 = vcvtdq2ps_avx(auVar79);
  uVar31 = (ulong)(uint)((int)(uVar39 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar74 = vpmovsxbd_avx2(auVar6);
  auVar80 = vcvtdq2ps_avx(auVar74);
  auVar134._4_4_ = fVar106;
  auVar134._0_4_ = fVar106;
  auVar134._8_4_ = fVar106;
  auVar134._12_4_ = fVar106;
  auVar134._16_4_ = fVar106;
  auVar134._20_4_ = fVar106;
  auVar134._24_4_ = fVar106;
  auVar134._28_4_ = fVar106;
  auVar239._8_4_ = 1;
  auVar239._0_8_ = 0x100000001;
  auVar239._12_4_ = 1;
  auVar239._16_4_ = 1;
  auVar239._20_4_ = 1;
  auVar239._24_4_ = 1;
  auVar239._28_4_ = 1;
  auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar83 = ZEXT1632(CONCAT412(fVar124 * auVar49._12_4_,
                               CONCAT48(fVar124 * auVar49._8_4_,
                                        CONCAT44(fVar124 * auVar49._4_4_,fVar106))));
  auVar82 = vpermps_avx2(auVar239,auVar83);
  auVar73 = vpermps_avx512vl(auVar72,auVar83);
  fVar106 = auVar73._0_4_;
  fVar201 = auVar73._4_4_;
  auVar83._4_4_ = fVar201 * auVar88._4_4_;
  auVar83._0_4_ = fVar106 * auVar88._0_4_;
  fVar212 = auVar73._8_4_;
  auVar83._8_4_ = fVar212 * auVar88._8_4_;
  fVar214 = auVar73._12_4_;
  auVar83._12_4_ = fVar214 * auVar88._12_4_;
  fVar111 = auVar73._16_4_;
  auVar83._16_4_ = fVar111 * auVar88._16_4_;
  fVar112 = auVar73._20_4_;
  auVar83._20_4_ = fVar112 * auVar88._20_4_;
  fVar113 = auVar73._24_4_;
  auVar83._24_4_ = fVar113 * auVar88._24_4_;
  auVar83._28_4_ = auVar81._28_4_;
  auVar81._4_4_ = auVar76._4_4_ * fVar201;
  auVar81._0_4_ = auVar76._0_4_ * fVar106;
  auVar81._8_4_ = auVar76._8_4_ * fVar212;
  auVar81._12_4_ = auVar76._12_4_ * fVar214;
  auVar81._16_4_ = auVar76._16_4_ * fVar111;
  auVar81._20_4_ = auVar76._20_4_ * fVar112;
  auVar81._24_4_ = auVar76._24_4_ * fVar113;
  auVar81._28_4_ = auVar74._28_4_;
  auVar74._4_4_ = auVar80._4_4_ * fVar201;
  auVar74._0_4_ = auVar80._0_4_ * fVar106;
  auVar74._8_4_ = auVar80._8_4_ * fVar212;
  auVar74._12_4_ = auVar80._12_4_ * fVar214;
  auVar74._16_4_ = auVar80._16_4_ * fVar111;
  auVar74._20_4_ = auVar80._20_4_ * fVar112;
  auVar74._24_4_ = auVar80._24_4_ * fVar113;
  auVar74._28_4_ = auVar73._28_4_;
  auVar46 = vfmadd231ps_fma(auVar83,auVar82,auVar75);
  auVar58 = vfmadd231ps_fma(auVar81,auVar82,auVar90);
  auVar4 = vfmadd231ps_fma(auVar74,auVar79,auVar82);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar134,auVar77);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar134,auVar89);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar78,auVar134);
  auVar147._4_4_ = fVar123;
  auVar147._0_4_ = fVar123;
  auVar147._8_4_ = fVar123;
  auVar147._12_4_ = fVar123;
  auVar147._16_4_ = fVar123;
  auVar147._20_4_ = fVar123;
  auVar147._24_4_ = fVar123;
  auVar147._28_4_ = fVar123;
  auVar74 = ZEXT1632(CONCAT412(fVar124 * auVar47._12_4_,
                               CONCAT48(fVar124 * auVar47._8_4_,
                                        CONCAT44(fVar124 * auVar47._4_4_,fVar123))));
  auVar81 = vpermps_avx2(auVar239,auVar74);
  auVar74 = vpermps_avx512vl(auVar72,auVar74);
  fVar124 = auVar74._0_4_;
  fVar106 = auVar74._4_4_;
  auVar82._4_4_ = fVar106 * auVar88._4_4_;
  auVar82._0_4_ = fVar124 * auVar88._0_4_;
  fVar201 = auVar74._8_4_;
  auVar82._8_4_ = fVar201 * auVar88._8_4_;
  fVar212 = auVar74._12_4_;
  auVar82._12_4_ = fVar212 * auVar88._12_4_;
  fVar214 = auVar74._16_4_;
  auVar82._16_4_ = fVar214 * auVar88._16_4_;
  fVar111 = auVar74._20_4_;
  auVar82._20_4_ = fVar111 * auVar88._20_4_;
  fVar112 = auVar74._24_4_;
  auVar82._24_4_ = fVar112 * auVar88._24_4_;
  auVar82._28_4_ = 1;
  auVar72._4_4_ = auVar76._4_4_ * fVar106;
  auVar72._0_4_ = auVar76._0_4_ * fVar124;
  auVar72._8_4_ = auVar76._8_4_ * fVar201;
  auVar72._12_4_ = auVar76._12_4_ * fVar212;
  auVar72._16_4_ = auVar76._16_4_ * fVar214;
  auVar72._20_4_ = auVar76._20_4_ * fVar111;
  auVar72._24_4_ = auVar76._24_4_ * fVar112;
  auVar72._28_4_ = auVar88._28_4_;
  auVar76._4_4_ = auVar80._4_4_ * fVar106;
  auVar76._0_4_ = auVar80._0_4_ * fVar124;
  auVar76._8_4_ = auVar80._8_4_ * fVar201;
  auVar76._12_4_ = auVar80._12_4_ * fVar212;
  auVar76._16_4_ = auVar80._16_4_ * fVar214;
  auVar76._20_4_ = auVar80._20_4_ * fVar111;
  auVar76._24_4_ = auVar80._24_4_ * fVar112;
  auVar76._28_4_ = auVar74._28_4_;
  auVar57 = vfmadd231ps_fma(auVar82,auVar81,auVar75);
  auVar56 = vfmadd231ps_fma(auVar72,auVar81,auVar90);
  auVar55 = vfmadd231ps_fma(auVar76,auVar81,auVar79);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar147,auVar77);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar147,auVar89);
  auVar91._8_4_ = 0x7fffffff;
  auVar91._0_8_ = 0x7fffffff7fffffff;
  auVar91._12_4_ = 0x7fffffff;
  auVar91._16_4_ = 0x7fffffff;
  auVar91._20_4_ = 0x7fffffff;
  auVar91._24_4_ = 0x7fffffff;
  auVar91._28_4_ = 0x7fffffff;
  auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar147,auVar78);
  auVar77 = vandps_avx(ZEXT1632(auVar46),auVar91);
  auVar93._8_4_ = 0x219392ef;
  auVar93._0_8_ = 0x219392ef219392ef;
  auVar93._12_4_ = 0x219392ef;
  auVar93._16_4_ = 0x219392ef;
  auVar93._20_4_ = 0x219392ef;
  auVar93._24_4_ = 0x219392ef;
  auVar93._28_4_ = 0x219392ef;
  uVar38 = vcmpps_avx512vl(auVar77,auVar93,1);
  bVar41 = (bool)((byte)uVar38 & 1);
  auVar73._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._0_4_;
  bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._4_4_;
  bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._8_4_;
  bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar46._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar77 = vandps_avx(ZEXT1632(auVar58),auVar91);
  uVar38 = vcmpps_avx512vl(auVar77,auVar93,1);
  bVar41 = (bool)((byte)uVar38 & 1);
  auVar84._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._0_4_;
  bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._4_4_;
  bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._8_4_;
  bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar58._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar77 = vandps_avx(ZEXT1632(auVar4),auVar91);
  uVar38 = vcmpps_avx512vl(auVar77,auVar93,1);
  bVar41 = (bool)((byte)uVar38 & 1);
  auVar77._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._0_4_;
  bVar41 = (bool)((byte)(uVar38 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._4_4_;
  bVar41 = (bool)((byte)(uVar38 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._8_4_;
  bVar41 = (bool)((byte)(uVar38 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar4._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar38 >> 7) * 0x219392ef;
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar92._8_4_ = 0x3f800000;
  auVar92._0_8_ = 0x3f8000003f800000;
  auVar92._12_4_ = 0x3f800000;
  auVar92._16_4_ = 0x3f800000;
  auVar92._20_4_ = 0x3f800000;
  auVar92._24_4_ = 0x3f800000;
  auVar92._28_4_ = 0x3f800000;
  auVar46 = vfnmadd213ps_fma(auVar73,auVar75,auVar92);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar84);
  auVar58 = vfnmadd213ps_fma(auVar84,auVar75,auVar92);
  auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar77);
  auVar4 = vfnmadd213ps_fma(auVar77,auVar75,auVar92);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar75,auVar75);
  auVar77 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 * 7 + 6));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,ZEXT1632(auVar57));
  auVar78._4_4_ = auVar46._4_4_ * auVar77._4_4_;
  auVar78._0_4_ = auVar46._0_4_ * auVar77._0_4_;
  auVar78._8_4_ = auVar46._8_4_ * auVar77._8_4_;
  auVar78._12_4_ = auVar46._12_4_ * auVar77._12_4_;
  auVar78._16_4_ = auVar77._16_4_ * 0.0;
  auVar78._20_4_ = auVar77._20_4_ * 0.0;
  auVar78._24_4_ = auVar77._24_4_ * 0.0;
  auVar78._28_4_ = auVar77._28_4_;
  auVar77 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 * 9 + 6));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,ZEXT1632(auVar57));
  auVar76 = vpbroadcastd_avx512vl();
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar87._0_4_ = auVar46._0_4_ * auVar77._0_4_;
  auVar87._4_4_ = auVar46._4_4_ * auVar77._4_4_;
  auVar87._8_4_ = auVar46._8_4_ * auVar77._8_4_;
  auVar87._12_4_ = auVar46._12_4_ * auVar77._12_4_;
  auVar87._16_4_ = auVar77._16_4_ * 0.0;
  auVar87._20_4_ = auVar77._20_4_ * 0.0;
  auVar87._24_4_ = auVar77._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar77 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar39 * -2 + 6));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,ZEXT1632(auVar56));
  auVar79._4_4_ = auVar58._4_4_ * auVar77._4_4_;
  auVar79._0_4_ = auVar58._0_4_ * auVar77._0_4_;
  auVar79._8_4_ = auVar58._8_4_ * auVar77._8_4_;
  auVar79._12_4_ = auVar58._12_4_ * auVar77._12_4_;
  auVar79._16_4_ = auVar77._16_4_ * 0.0;
  auVar79._20_4_ = auVar77._20_4_ * 0.0;
  auVar79._24_4_ = auVar77._24_4_ * 0.0;
  auVar79._28_4_ = auVar77._28_4_;
  auVar77 = vcvtdq2ps_avx(auVar75);
  auVar77 = vsubps_avx(auVar77,ZEXT1632(auVar56));
  auVar86._0_4_ = auVar58._0_4_ * auVar77._0_4_;
  auVar86._4_4_ = auVar58._4_4_ * auVar77._4_4_;
  auVar86._8_4_ = auVar58._8_4_ * auVar77._8_4_;
  auVar86._12_4_ = auVar58._12_4_ * auVar77._12_4_;
  auVar86._16_4_ = auVar77._16_4_ * 0.0;
  auVar86._20_4_ = auVar77._20_4_ * 0.0;
  auVar86._24_4_ = auVar77._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar77 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + uVar39 + 6));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,ZEXT1632(auVar55));
  auVar80._4_4_ = auVar77._4_4_ * auVar4._4_4_;
  auVar80._0_4_ = auVar77._0_4_ * auVar4._0_4_;
  auVar80._8_4_ = auVar77._8_4_ * auVar4._8_4_;
  auVar80._12_4_ = auVar77._12_4_ * auVar4._12_4_;
  auVar80._16_4_ = auVar77._16_4_ * 0.0;
  auVar80._20_4_ = auVar77._20_4_ * 0.0;
  auVar80._24_4_ = auVar77._24_4_ * 0.0;
  auVar80._28_4_ = auVar77._28_4_;
  auVar77 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 * 0x17 + 6));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,ZEXT1632(auVar55));
  auVar85._0_4_ = auVar4._0_4_ * auVar77._0_4_;
  auVar85._4_4_ = auVar4._4_4_ * auVar77._4_4_;
  auVar85._8_4_ = auVar4._8_4_ * auVar77._8_4_;
  auVar85._12_4_ = auVar4._12_4_ * auVar77._12_4_;
  auVar85._16_4_ = auVar77._16_4_ * 0.0;
  auVar85._20_4_ = auVar77._20_4_ * 0.0;
  auVar85._24_4_ = auVar77._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar77 = vpminsd_avx2(auVar78,auVar87);
  auVar75 = vpminsd_avx2(auVar79,auVar86);
  auVar77 = vmaxps_avx(auVar77,auVar75);
  auVar75 = vpminsd_avx2(auVar80,auVar85);
  uVar114 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar88._4_4_ = uVar114;
  auVar88._0_4_ = uVar114;
  auVar88._8_4_ = uVar114;
  auVar88._12_4_ = uVar114;
  auVar88._16_4_ = uVar114;
  auVar88._20_4_ = uVar114;
  auVar88._24_4_ = uVar114;
  auVar88._28_4_ = uVar114;
  auVar75 = vmaxps_avx512vl(auVar75,auVar88);
  auVar77 = vmaxps_avx(auVar77,auVar75);
  auVar75._8_4_ = 0x3f7ffffa;
  auVar75._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar75._12_4_ = 0x3f7ffffa;
  auVar75._16_4_ = 0x3f7ffffa;
  auVar75._20_4_ = 0x3f7ffffa;
  auVar75._24_4_ = 0x3f7ffffa;
  auVar75._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar77,auVar75);
  auVar77 = vpmaxsd_avx2(auVar78,auVar87);
  auVar75 = vpmaxsd_avx2(auVar79,auVar86);
  auVar77 = vminps_avx(auVar77,auVar75);
  auVar75 = vpmaxsd_avx2(auVar80,auVar85);
  uVar114 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar89._4_4_ = uVar114;
  auVar89._0_4_ = uVar114;
  auVar89._8_4_ = uVar114;
  auVar89._12_4_ = uVar114;
  auVar89._16_4_ = uVar114;
  auVar89._20_4_ = uVar114;
  auVar89._24_4_ = uVar114;
  auVar89._28_4_ = uVar114;
  auVar75 = vminps_avx512vl(auVar75,auVar89);
  auVar77 = vminps_avx(auVar77,auVar75);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar90);
  uVar18 = vpcmpgtd_avx512vl(auVar76,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_1c0,auVar77,2);
  if ((byte)((byte)uVar17 & (byte)uVar18) == 0) {
    return false;
  }
  uVar38 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar241 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar242 = ZEXT1664(auVar46);
  auVar249 = ZEXT464(0x3f800000);
  auVar46 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar248 = ZEXT1664(auVar46);
LAB_01d39546:
  lVar34 = 0;
  for (uVar31 = uVar38; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar34 = lVar34 + 1;
  }
  uVar40 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar40].ptr;
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar34 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar46 = *(undefined1 (*) [16])(_Var12 + uVar31 * (long)pvVar11);
  auVar58 = *(undefined1 (*) [16])(_Var12 + (uVar31 + 1) * (long)pvVar11);
  auVar4 = *(undefined1 (*) [16])(_Var12 + (uVar31 + 2) * (long)pvVar11);
  auVar57 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar31 + 3));
  lVar34 = *(long *)&pGVar9[1].time_range.upper;
  auVar56 = *(undefined1 (*) [16])(lVar34 + (long)p_Var10 * uVar31);
  auVar55 = *(undefined1 (*) [16])(lVar34 + (long)p_Var10 * (uVar31 + 1));
  auVar5 = *(undefined1 (*) [16])(lVar34 + (long)p_Var10 * (uVar31 + 2));
  uVar38 = uVar38 - 1 & uVar38;
  auVar54 = *(undefined1 (*) [16])(lVar34 + (long)p_Var10 * (uVar31 + 3));
  if (uVar38 != 0) {
    uVar39 = uVar38 - 1 & uVar38;
    for (uVar31 = uVar38; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    }
    if (uVar39 != 0) {
      for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar117 = auVar240._0_16_;
  auVar47 = vmulps_avx512vl(auVar54,auVar117);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar5,auVar47);
  auVar48._0_4_ = auVar55._0_4_ + auVar49._0_4_;
  auVar48._4_4_ = auVar55._4_4_ + auVar49._4_4_;
  auVar48._8_4_ = auVar55._8_4_ + auVar49._8_4_;
  auVar48._12_4_ = auVar55._12_4_ + auVar49._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar117);
  auVar59 = ZEXT816(0) << 0x40;
  auVar52._0_4_ = auVar54._0_4_ * 0.0;
  auVar52._4_4_ = auVar54._4_4_ * 0.0;
  auVar52._8_4_ = auVar54._8_4_ * 0.0;
  auVar52._12_4_ = auVar54._12_4_ * 0.0;
  auVar115 = auVar241._0_16_;
  auVar49 = vfmadd231ps_avx512vl(auVar52,auVar5,auVar115);
  auVar49 = vfmadd231ps_fma(auVar49,auVar55,auVar59);
  auVar50 = vfnmadd231ps_avx512vl(auVar49,auVar56,auVar115);
  auVar51 = vmulps_avx512vl(auVar57,auVar117);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar51);
  auVar227._0_4_ = auVar49._0_4_ + auVar58._0_4_;
  auVar227._4_4_ = auVar49._4_4_ + auVar58._4_4_;
  auVar227._8_4_ = auVar49._8_4_ + auVar58._8_4_;
  auVar227._12_4_ = auVar49._12_4_ + auVar58._12_4_;
  auVar52 = vfmadd231ps_avx512vl(auVar227,auVar46,auVar117);
  auVar231._0_4_ = auVar57._0_4_ * 0.0;
  auVar231._4_4_ = auVar57._4_4_ * 0.0;
  auVar231._8_4_ = auVar57._8_4_ * 0.0;
  auVar231._12_4_ = auVar57._12_4_ * 0.0;
  auVar49 = vfmadd231ps_avx512vl(auVar231,auVar4,auVar115);
  auVar49 = vfmadd231ps_fma(auVar49,auVar58,auVar59);
  auVar53 = vfnmadd231ps_avx512vl(auVar49,auVar46,auVar115);
  auVar71._0_4_ = auVar5._0_4_ + auVar47._0_4_;
  auVar71._4_4_ = auVar5._4_4_ + auVar47._4_4_;
  auVar71._8_4_ = auVar5._8_4_ + auVar47._8_4_;
  auVar71._12_4_ = auVar5._12_4_ + auVar47._12_4_;
  auVar49 = vfmadd231ps_fma(auVar71,auVar55,auVar59);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar56,auVar117);
  auVar54 = vmulps_avx512vl(auVar54,auVar115);
  auVar5 = vfmadd231ps_fma(auVar54,auVar59,auVar5);
  auVar55 = vfnmadd231ps_avx512vl(auVar5,auVar115,auVar55);
  auVar5 = vfmadd231ps_fma(auVar55,auVar59,auVar56);
  auVar180._0_4_ = auVar51._0_4_ + auVar4._0_4_;
  auVar180._4_4_ = auVar51._4_4_ + auVar4._4_4_;
  auVar180._8_4_ = auVar51._8_4_ + auVar4._8_4_;
  auVar180._12_4_ = auVar51._12_4_ + auVar4._12_4_;
  auVar56 = vfmadd231ps_fma(auVar180,auVar58,auVar59);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar46,auVar117);
  auVar57 = vmulps_avx512vl(auVar57,auVar115);
  auVar4 = vfmadd231ps_fma(auVar57,auVar59,auVar4);
  auVar58 = vfnmadd231ps_avx512vl(auVar4,auVar115,auVar58);
  auVar55 = vfmadd231ps_fma(auVar58,auVar59,auVar46);
  auVar46 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar58 = vshufps_avx(auVar52,auVar52,0xc9);
  fVar214 = auVar50._0_4_;
  auVar61._0_4_ = fVar214 * auVar58._0_4_;
  fVar111 = auVar50._4_4_;
  auVar61._4_4_ = fVar111 * auVar58._4_4_;
  fVar112 = auVar50._8_4_;
  auVar61._8_4_ = fVar112 * auVar58._8_4_;
  fVar113 = auVar50._12_4_;
  auVar61._12_4_ = fVar113 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar61,auVar46,auVar52);
  auVar4 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar62._0_4_ = fVar214 * auVar58._0_4_;
  auVar62._4_4_ = fVar111 * auVar58._4_4_;
  auVar62._8_4_ = fVar112 * auVar58._8_4_;
  auVar62._12_4_ = fVar113 * auVar58._12_4_;
  auVar46 = vfmsub231ps_fma(auVar62,auVar46,auVar53);
  auVar57 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar58 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar123 = auVar5._0_4_;
  auVar66._0_4_ = fVar123 * auVar58._0_4_;
  fVar137 = auVar5._4_4_;
  auVar66._4_4_ = fVar137 * auVar58._4_4_;
  fVar138 = auVar5._8_4_;
  auVar66._8_4_ = fVar138 * auVar58._8_4_;
  fVar139 = auVar5._12_4_;
  auVar66._12_4_ = fVar139 * auVar58._12_4_;
  auVar58 = vfmsub231ps_fma(auVar66,auVar46,auVar56);
  auVar56 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar58 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar181._0_4_ = auVar58._0_4_ * fVar123;
  auVar181._4_4_ = auVar58._4_4_ * fVar137;
  auVar181._8_4_ = auVar58._8_4_ * fVar138;
  auVar181._12_4_ = auVar58._12_4_ * fVar139;
  auVar46 = vfmsub231ps_fma(auVar181,auVar46,auVar55);
  auVar55 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar106 = auVar46._0_4_;
  auVar182._4_12_ = ZEXT812(0) << 0x20;
  auVar182._0_4_ = fVar106;
  auVar58 = vrsqrt14ss_avx512f(auVar59,auVar182);
  auVar54 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar46,ZEXT416(0xbf000000));
  fVar124 = auVar58._0_4_;
  fVar124 = auVar54._0_4_ + auVar47._0_4_ * fVar124 * fVar124 * fVar124;
  fVar216 = fVar124 * auVar4._0_4_;
  fVar224 = fVar124 * auVar4._4_4_;
  fVar225 = fVar124 * auVar4._8_4_;
  fVar226 = fVar124 * auVar4._12_4_;
  auVar58 = vdpps_avx(auVar4,auVar57,0x7f);
  auVar193._0_4_ = auVar57._0_4_ * fVar106;
  auVar193._4_4_ = auVar57._4_4_ * fVar106;
  auVar193._8_4_ = auVar57._8_4_ * fVar106;
  auVar193._12_4_ = auVar57._12_4_ * fVar106;
  fVar106 = auVar58._0_4_;
  auVar159._0_4_ = fVar106 * auVar4._0_4_;
  auVar159._4_4_ = fVar106 * auVar4._4_4_;
  auVar159._8_4_ = fVar106 * auVar4._8_4_;
  auVar159._12_4_ = fVar106 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar193,auVar159);
  auVar58 = vrcp14ss_avx512f(auVar59,auVar182);
  auVar46 = vfnmadd213ss_avx512f(auVar46,auVar58,ZEXT416(0x40000000));
  fVar201 = auVar58._0_4_ * auVar46._0_4_;
  auVar46 = vdpps_avx(auVar56,auVar56,0x7f);
  fVar212 = auVar46._0_4_;
  auVar173._4_12_ = ZEXT812(0) << 0x20;
  auVar173._0_4_ = fVar212;
  auVar58 = vrsqrt14ss_avx512f(auVar59,auVar173);
  auVar57 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar46,ZEXT416(0xbf000000));
  fVar106 = auVar58._0_4_;
  fVar106 = auVar57._0_4_ + auVar54._0_4_ * fVar106 * fVar106 * fVar106;
  fVar200 = fVar106 * auVar56._0_4_;
  fVar211 = fVar106 * auVar56._4_4_;
  fVar213 = fVar106 * auVar56._8_4_;
  fVar215 = fVar106 * auVar56._12_4_;
  auVar58 = vdpps_avx(auVar56,auVar55,0x7f);
  auVar69._0_4_ = fVar212 * auVar55._0_4_;
  auVar69._4_4_ = fVar212 * auVar55._4_4_;
  auVar69._8_4_ = fVar212 * auVar55._8_4_;
  auVar69._12_4_ = fVar212 * auVar55._12_4_;
  fVar212 = auVar58._0_4_;
  auVar140._0_4_ = fVar212 * auVar56._0_4_;
  auVar140._4_4_ = fVar212 * auVar56._4_4_;
  auVar140._8_4_ = fVar212 * auVar56._8_4_;
  auVar140._12_4_ = fVar212 * auVar56._12_4_;
  auVar57 = vsubps_avx(auVar69,auVar140);
  auVar58 = vrcp14ss_avx512f(auVar59,auVar173);
  auVar46 = vfnmadd213ss_avx512f(auVar46,auVar58,ZEXT416(0x40000000));
  fVar212 = auVar46._0_4_ * auVar58._0_4_;
  auVar46 = vshufps_avx(auVar48,auVar48,0xff);
  auVar174._0_4_ = fVar216 * auVar46._0_4_;
  auVar174._4_4_ = fVar224 * auVar46._4_4_;
  auVar174._8_4_ = fVar225 * auVar46._8_4_;
  auVar174._12_4_ = fVar226 * auVar46._12_4_;
  local_310 = vsubps_avx(auVar48,auVar174);
  auVar58 = vshufps_avx(auVar50,auVar50,0xff);
  auVar70._0_4_ = auVar58._0_4_ * fVar216 + auVar46._0_4_ * fVar124 * fVar201 * auVar4._0_4_;
  auVar70._4_4_ = auVar58._4_4_ * fVar224 + auVar46._4_4_ * fVar124 * fVar201 * auVar4._4_4_;
  auVar70._8_4_ = auVar58._8_4_ * fVar225 + auVar46._8_4_ * fVar124 * fVar201 * auVar4._8_4_;
  auVar70._12_4_ = auVar58._12_4_ * fVar226 + auVar46._12_4_ * fVar124 * fVar201 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar50,auVar70);
  local_320._0_4_ = auVar174._0_4_ + auVar48._0_4_;
  local_320._4_4_ = auVar174._4_4_ + auVar48._4_4_;
  fStack_318 = auVar174._8_4_ + auVar48._8_4_;
  fStack_314 = auVar174._12_4_ + auVar48._12_4_;
  auVar46 = vshufps_avx(auVar49,auVar49,0xff);
  auVar151._0_4_ = fVar200 * auVar46._0_4_;
  auVar151._4_4_ = fVar211 * auVar46._4_4_;
  auVar151._8_4_ = fVar213 * auVar46._8_4_;
  auVar151._12_4_ = fVar215 * auVar46._12_4_;
  local_330 = vsubps_avx(auVar49,auVar151);
  auVar58 = vshufps_avx(auVar5,auVar5,0xff);
  auVar53._0_4_ = auVar58._0_4_ * fVar200 + auVar46._0_4_ * fVar106 * auVar57._0_4_ * fVar212;
  auVar53._4_4_ = auVar58._4_4_ * fVar211 + auVar46._4_4_ * fVar106 * auVar57._4_4_ * fVar212;
  auVar53._8_4_ = auVar58._8_4_ * fVar213 + auVar46._8_4_ * fVar106 * auVar57._8_4_ * fVar212;
  auVar53._12_4_ = auVar58._12_4_ * fVar215 + auVar46._12_4_ * fVar106 * auVar57._12_4_ * fVar212;
  auVar46 = vsubps_avx(auVar5,auVar53);
  _local_340 = vaddps_avx512vl(auVar49,auVar151);
  auVar63._0_4_ = auVar4._0_4_ * 0.33333334;
  auVar63._4_4_ = auVar4._4_4_ * 0.33333334;
  auVar63._8_4_ = auVar4._8_4_ * 0.33333334;
  auVar63._12_4_ = auVar4._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar63);
  auVar64._0_4_ = auVar46._0_4_ * 0.33333334;
  auVar64._4_4_ = auVar46._4_4_ * 0.33333334;
  auVar64._8_4_ = auVar46._8_4_ * 0.33333334;
  auVar64._12_4_ = auVar46._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar64);
  auVar47._0_4_ = (fVar214 + auVar70._0_4_) * 0.33333334;
  auVar47._4_4_ = (fVar111 + auVar70._4_4_) * 0.33333334;
  auVar47._8_4_ = (fVar112 + auVar70._8_4_) * 0.33333334;
  auVar47._12_4_ = (fVar113 + auVar70._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar47);
  auVar50._0_4_ = (fVar123 + auVar53._0_4_) * 0.33333334;
  auVar50._4_4_ = (fVar137 + auVar53._4_4_) * 0.33333334;
  auVar50._8_4_ = (fVar138 + auVar53._8_4_) * 0.33333334;
  auVar50._12_4_ = (fVar139 + auVar53._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar50);
  local_290 = vsubps_avx(local_310,auVar6);
  uVar114 = local_290._0_4_;
  auVar60._4_4_ = uVar114;
  auVar60._0_4_ = uVar114;
  auVar60._8_4_ = uVar114;
  auVar60._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_290,local_290,0x55);
  auVar58 = vshufps_avx(local_290,local_290,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar124 = pre->ray_space[k].vz.field_0.m128[0];
  fVar106 = pre->ray_space[k].vz.field_0.m128[1];
  fVar201 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  auVar51._0_4_ = fVar124 * auVar58._0_4_;
  auVar51._4_4_ = fVar106 * auVar58._4_4_;
  auVar51._8_4_ = fVar201 * auVar58._8_4_;
  auVar51._12_4_ = fVar212 * auVar58._12_4_;
  auVar46 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar46);
  auVar49 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar60);
  local_2a0 = vsubps_avx512vl(local_350,auVar6);
  uVar114 = local_2a0._0_4_;
  auVar67._4_4_ = uVar114;
  auVar67._0_4_ = uVar114;
  auVar67._8_4_ = uVar114;
  auVar67._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar58 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar68._0_4_ = fVar124 * auVar58._0_4_;
  auVar68._4_4_ = fVar106 * auVar58._4_4_;
  auVar68._8_4_ = fVar201 * auVar58._8_4_;
  auVar68._12_4_ = fVar212 * auVar58._12_4_;
  auVar46 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar3,auVar46);
  auVar47 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar67);
  local_2b0 = vsubps_avx512vl(local_360,auVar6);
  uVar114 = local_2b0._0_4_;
  auVar160._4_4_ = uVar114;
  auVar160._0_4_ = uVar114;
  auVar160._8_4_ = uVar114;
  auVar160._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar58 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar65._0_4_ = fVar124 * auVar58._0_4_;
  auVar65._4_4_ = fVar106 * auVar58._4_4_;
  auVar65._8_4_ = fVar201 * auVar58._8_4_;
  auVar65._12_4_ = fVar212 * auVar58._12_4_;
  auVar46 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar3,auVar46);
  auVar48 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar160);
  local_2c0 = vsubps_avx(local_330,auVar6);
  uVar114 = local_2c0._0_4_;
  auVar161._4_4_ = uVar114;
  auVar161._0_4_ = uVar114;
  auVar161._8_4_ = uVar114;
  auVar161._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar58 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar183._0_4_ = auVar58._0_4_ * fVar124;
  auVar183._4_4_ = auVar58._4_4_ * fVar106;
  auVar183._8_4_ = auVar58._8_4_ * fVar201;
  auVar183._12_4_ = auVar58._12_4_ * fVar212;
  auVar46 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar3,auVar46);
  auVar50 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar161);
  local_2d0 = vsubps_avx(_local_320,auVar6);
  uVar114 = local_2d0._0_4_;
  auVar162._4_4_ = uVar114;
  auVar162._0_4_ = uVar114;
  auVar162._8_4_ = uVar114;
  auVar162._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar58 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar194._0_4_ = auVar58._0_4_ * fVar124;
  auVar194._4_4_ = auVar58._4_4_ * fVar106;
  auVar194._8_4_ = auVar58._8_4_ * fVar201;
  auVar194._12_4_ = auVar58._12_4_ * fVar212;
  auVar46 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar3,auVar46);
  auVar51 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar162);
  local_2e0 = vsubps_avx512vl(_local_370,auVar6);
  uVar114 = local_2e0._0_4_;
  auVar163._4_4_ = uVar114;
  auVar163._0_4_ = uVar114;
  auVar163._8_4_ = uVar114;
  auVar163._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar58 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar202._0_4_ = auVar58._0_4_ * fVar124;
  auVar202._4_4_ = auVar58._4_4_ * fVar106;
  auVar202._8_4_ = auVar58._8_4_ * fVar201;
  auVar202._12_4_ = auVar58._12_4_ * fVar212;
  auVar46 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar3,auVar46);
  auVar52 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar163);
  local_2f0 = vsubps_avx512vl(_local_380,auVar6);
  uVar114 = local_2f0._0_4_;
  auVar164._4_4_ = uVar114;
  auVar164._0_4_ = uVar114;
  auVar164._8_4_ = uVar114;
  auVar164._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar58 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar217._0_4_ = auVar58._0_4_ * fVar124;
  auVar217._4_4_ = auVar58._4_4_ * fVar106;
  auVar217._8_4_ = auVar58._8_4_ * fVar201;
  auVar217._12_4_ = auVar58._12_4_ * fVar212;
  auVar46 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar3,auVar46);
  auVar53 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar164);
  local_300 = vsubps_avx512vl(_local_340,auVar6);
  uVar114 = local_300._0_4_;
  auVar59._4_4_ = uVar114;
  auVar59._0_4_ = uVar114;
  auVar59._8_4_ = uVar114;
  auVar59._12_4_ = uVar114;
  auVar46 = vshufps_avx(local_300,local_300,0x55);
  auVar58 = vshufps_avx(local_300,local_300,0xaa);
  auVar152._0_4_ = auVar58._0_4_ * fVar124;
  auVar152._4_4_ = auVar58._4_4_ * fVar106;
  auVar152._8_4_ = auVar58._8_4_ * fVar201;
  auVar152._12_4_ = auVar58._12_4_ * fVar212;
  auVar46 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar3,auVar46);
  auVar6 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar2,auVar59);
  auVar4 = vmovlhps_avx(auVar49,auVar51);
  auVar55 = vmovlhps_avx512f(auVar47,auVar52);
  auVar5 = vmovlhps_avx512f(auVar48,auVar53);
  auVar54 = vmovlhps_avx512f(auVar50,auVar6);
  auVar46 = vminps_avx512vl(auVar4,auVar55);
  auVar57 = vmaxps_avx512vl(auVar4,auVar55);
  auVar58 = vminps_avx512vl(auVar5,auVar54);
  auVar58 = vminps_avx(auVar46,auVar58);
  auVar46 = vmaxps_avx512vl(auVar5,auVar54);
  auVar46 = vmaxps_avx(auVar57,auVar46);
  auVar57 = vshufpd_avx(auVar58,auVar58,3);
  auVar56 = vshufpd_avx(auVar46,auVar46,3);
  auVar58 = vminps_avx(auVar58,auVar57);
  auVar46 = vmaxps_avx(auVar46,auVar56);
  auVar58 = vandps_avx512vl(auVar58,auVar242._0_16_);
  auVar46 = vandps_avx512vl(auVar46,auVar242._0_16_);
  auVar46 = vmaxps_avx(auVar58,auVar46);
  auVar58 = vmovshdup_avx(auVar46);
  auVar46 = vmaxss_avx(auVar58,auVar46);
  fVar124 = auVar46._0_4_ * 9.536743e-07;
  auVar165._8_8_ = auVar49._0_8_;
  auVar165._0_8_ = auVar49._0_8_;
  auVar58 = vmovddup_avx512vl(auVar47);
  auVar57 = vmovddup_avx512vl(auVar48);
  auVar115._8_8_ = auVar50._0_8_;
  auVar115._0_8_ = auVar50._0_8_;
  local_260 = vbroadcastss_avx512vl(ZEXT416((uint)fVar124));
  auVar46 = vxorps_avx512vl(local_260._0_16_,auVar117);
  auVar77 = vbroadcastss_avx512vl(auVar46);
  local_1e0 = vpbroadcastd_avx512vl();
  bVar41 = false;
  uVar31 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  auVar56 = vsubps_avx512vl(auVar55,auVar4);
  local_270 = vsubps_avx512vl(auVar5,auVar55);
  local_280 = vsubps_avx512vl(auVar54,auVar5);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_200 = vpbroadcastd_avx512vl();
  auVar46 = ZEXT816(0x3f80000000000000);
  auVar49 = auVar46;
LAB_01d39cb5:
  do {
    auVar47 = vshufps_avx(auVar49,auVar49,0x50);
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar50 = vsubps_avx512vl(auVar78._0_16_,auVar47);
    fVar106 = auVar47._0_4_;
    fVar111 = auVar51._0_4_;
    auVar131._0_4_ = fVar111 * fVar106;
    fVar201 = auVar47._4_4_;
    fVar112 = auVar51._4_4_;
    auVar131._4_4_ = fVar112 * fVar201;
    fVar212 = auVar47._8_4_;
    auVar131._8_4_ = fVar111 * fVar212;
    fVar214 = auVar47._12_4_;
    auVar131._12_4_ = fVar112 * fVar214;
    fVar113 = auVar52._0_4_;
    auVar141._0_4_ = fVar113 * fVar106;
    fVar123 = auVar52._4_4_;
    auVar141._4_4_ = fVar123 * fVar201;
    auVar141._8_4_ = fVar113 * fVar212;
    auVar141._12_4_ = fVar123 * fVar214;
    fVar137 = auVar53._0_4_;
    auVar153._0_4_ = fVar137 * fVar106;
    fVar138 = auVar53._4_4_;
    auVar153._4_4_ = fVar138 * fVar201;
    auVar153._8_4_ = fVar137 * fVar212;
    auVar153._12_4_ = fVar138 * fVar214;
    fVar139 = auVar6._0_4_;
    auVar117._0_4_ = fVar139 * fVar106;
    fVar200 = auVar6._4_4_;
    auVar117._4_4_ = fVar200 * fVar201;
    auVar117._8_4_ = fVar139 * fVar212;
    auVar117._12_4_ = fVar200 * fVar214;
    auVar48 = vfmadd231ps_fma(auVar131,auVar50,auVar165);
    auVar59 = vfmadd231ps_avx512vl(auVar141,auVar50,auVar58);
    auVar60 = vfmadd231ps_avx512vl(auVar153,auVar50,auVar57);
    auVar50 = vfmadd231ps_fma(auVar117,auVar115,auVar50);
    auVar47 = vmovshdup_avx(auVar46);
    fVar201 = auVar46._0_4_;
    fVar106 = (auVar47._0_4_ - fVar201) * 0.04761905;
    auVar179._4_4_ = fVar201;
    auVar179._0_4_ = fVar201;
    auVar179._8_4_ = fVar201;
    auVar179._12_4_ = fVar201;
    auVar179._16_4_ = fVar201;
    auVar179._20_4_ = fVar201;
    auVar179._24_4_ = fVar201;
    auVar179._28_4_ = fVar201;
    auVar129._0_8_ = auVar47._0_8_;
    auVar129._8_8_ = auVar129._0_8_;
    auVar129._16_8_ = auVar129._0_8_;
    auVar129._24_8_ = auVar129._0_8_;
    auVar75 = vsubps_avx(auVar129,auVar179);
    uVar114 = auVar48._0_4_;
    auVar130._4_4_ = uVar114;
    auVar130._0_4_ = uVar114;
    auVar130._8_4_ = uVar114;
    auVar130._12_4_ = uVar114;
    auVar130._16_4_ = uVar114;
    auVar130._20_4_ = uVar114;
    auVar130._24_4_ = uVar114;
    auVar130._28_4_ = uVar114;
    auVar197._8_4_ = 1;
    auVar197._0_8_ = 0x100000001;
    auVar197._12_4_ = 1;
    auVar197._16_4_ = 1;
    auVar197._20_4_ = 1;
    auVar197._24_4_ = 1;
    auVar197._28_4_ = 1;
    auVar89 = ZEXT1632(auVar48);
    auVar88 = vpermps_avx2(auVar197,auVar89);
    auVar79 = vbroadcastss_avx512vl(auVar59);
    auVar90 = ZEXT1632(auVar59);
    auVar80 = vpermps_avx512vl(auVar197,auVar90);
    auVar81 = vbroadcastss_avx512vl(auVar60);
    auVar76 = ZEXT1632(auVar60);
    auVar74 = vpermps_avx512vl(auVar197,auVar76);
    auVar82 = vbroadcastss_avx512vl(auVar50);
    auVar86 = ZEXT1632(auVar50);
    auVar83 = vpermps_avx512vl(auVar197,auVar86);
    auVar198._4_4_ = fVar106;
    auVar198._0_4_ = fVar106;
    auVar198._8_4_ = fVar106;
    auVar198._12_4_ = fVar106;
    auVar198._16_4_ = fVar106;
    auVar198._20_4_ = fVar106;
    auVar198._24_4_ = fVar106;
    auVar198._28_4_ = fVar106;
    auVar234._8_4_ = 2;
    auVar234._0_8_ = 0x200000002;
    auVar234._12_4_ = 2;
    auVar234._16_4_ = 2;
    auVar234._20_4_ = 2;
    auVar234._24_4_ = 2;
    auVar234._28_4_ = 2;
    auVar72 = vpermps_avx512vl(auVar234,auVar89);
    auVar172._8_4_ = 3;
    auVar172._0_8_ = 0x300000003;
    auVar172._12_4_ = 3;
    auVar172._16_4_ = 3;
    auVar172._20_4_ = 3;
    auVar172._24_4_ = 3;
    auVar172._28_4_ = 3;
    auVar73 = vpermps_avx512vl(auVar172,auVar89);
    auVar84 = vpermps_avx512vl(auVar234,auVar90);
    auVar89 = vpermps_avx2(auVar172,auVar90);
    auVar90 = vpermps_avx2(auVar234,auVar76);
    auVar76 = vpermps_avx2(auVar172,auVar76);
    auVar85 = vpermps_avx512vl(auVar234,auVar86);
    auVar86 = vpermps_avx512vl(auVar172,auVar86);
    auVar47 = vfmadd132ps_fma(auVar75,auVar179,_DAT_01faff20);
    auVar78 = vsubps_avx512vl(auVar78,ZEXT1632(auVar47));
    auVar75 = vmulps_avx512vl(auVar79,ZEXT1632(auVar47));
    auVar91 = ZEXT1632(auVar47);
    auVar87 = vmulps_avx512vl(auVar80,auVar91);
    auVar48 = vfmadd231ps_fma(auVar75,auVar78,auVar130);
    auVar50 = vfmadd231ps_fma(auVar87,auVar78,auVar88);
    auVar75 = vmulps_avx512vl(auVar81,auVar91);
    auVar87 = vmulps_avx512vl(auVar74,auVar91);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar78,auVar79);
    auVar79 = vfmadd231ps_avx512vl(auVar87,auVar78,auVar80);
    auVar80 = vmulps_avx512vl(auVar82,auVar91);
    auVar87 = ZEXT1632(auVar47);
    auVar83 = vmulps_avx512vl(auVar83,auVar87);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar81);
    auVar81 = vfmadd231ps_avx512vl(auVar83,auVar78,auVar74);
    fVar212 = auVar47._0_4_;
    fVar214 = auVar47._4_4_;
    auVar25._4_4_ = fVar214 * auVar75._4_4_;
    auVar25._0_4_ = fVar212 * auVar75._0_4_;
    fVar211 = auVar47._8_4_;
    auVar25._8_4_ = fVar211 * auVar75._8_4_;
    fVar213 = auVar47._12_4_;
    auVar25._12_4_ = fVar213 * auVar75._12_4_;
    auVar25._16_4_ = auVar75._16_4_ * 0.0;
    auVar25._20_4_ = auVar75._20_4_ * 0.0;
    auVar25._24_4_ = auVar75._24_4_ * 0.0;
    auVar25._28_4_ = fVar201;
    auVar26._4_4_ = fVar214 * auVar79._4_4_;
    auVar26._0_4_ = fVar212 * auVar79._0_4_;
    auVar26._8_4_ = fVar211 * auVar79._8_4_;
    auVar26._12_4_ = fVar213 * auVar79._12_4_;
    auVar26._16_4_ = auVar79._16_4_ * 0.0;
    auVar26._20_4_ = auVar79._20_4_ * 0.0;
    auVar26._24_4_ = auVar79._24_4_ * 0.0;
    auVar26._28_4_ = auVar88._28_4_;
    auVar48 = vfmadd231ps_fma(auVar25,auVar78,ZEXT1632(auVar48));
    auVar50 = vfmadd231ps_fma(auVar26,auVar78,ZEXT1632(auVar50));
    auVar121._0_4_ = fVar212 * auVar80._0_4_;
    auVar121._4_4_ = fVar214 * auVar80._4_4_;
    auVar121._8_4_ = fVar211 * auVar80._8_4_;
    auVar121._12_4_ = fVar213 * auVar80._12_4_;
    auVar121._16_4_ = auVar80._16_4_ * 0.0;
    auVar121._20_4_ = auVar80._20_4_ * 0.0;
    auVar121._24_4_ = auVar80._24_4_ * 0.0;
    auVar121._28_4_ = 0;
    auVar27._4_4_ = fVar214 * auVar81._4_4_;
    auVar27._0_4_ = fVar212 * auVar81._0_4_;
    auVar27._8_4_ = fVar211 * auVar81._8_4_;
    auVar27._12_4_ = fVar213 * auVar81._12_4_;
    auVar27._16_4_ = auVar81._16_4_ * 0.0;
    auVar27._20_4_ = auVar81._20_4_ * 0.0;
    auVar27._24_4_ = auVar81._24_4_ * 0.0;
    auVar27._28_4_ = auVar80._28_4_;
    auVar59 = vfmadd231ps_fma(auVar121,auVar78,auVar75);
    auVar60 = vfmadd231ps_fma(auVar27,auVar78,auVar79);
    auVar28._28_4_ = auVar79._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar213 * auVar60._12_4_,
                            CONCAT48(fVar211 * auVar60._8_4_,
                                     CONCAT44(fVar214 * auVar60._4_4_,fVar212 * auVar60._0_4_))));
    auVar68 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar59._12_4_,
                                                 CONCAT48(fVar211 * auVar59._8_4_,
                                                          CONCAT44(fVar214 * auVar59._4_4_,
                                                                   fVar212 * auVar59._0_4_)))),
                              auVar78,ZEXT1632(auVar48));
    auVar71 = vfmadd231ps_fma(auVar28,auVar78,ZEXT1632(auVar50));
    auVar75 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar48));
    auVar88 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar50));
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar75 = vmulps_avx512vl(auVar75,auVar79);
    auVar88 = vmulps_avx512vl(auVar88,auVar79);
    auVar192._0_4_ = fVar106 * auVar75._0_4_;
    auVar192._4_4_ = fVar106 * auVar75._4_4_;
    auVar192._8_4_ = fVar106 * auVar75._8_4_;
    auVar192._12_4_ = fVar106 * auVar75._12_4_;
    auVar192._16_4_ = fVar106 * auVar75._16_4_;
    auVar192._20_4_ = fVar106 * auVar75._20_4_;
    auVar192._24_4_ = fVar106 * auVar75._24_4_;
    auVar192._28_4_ = 0;
    auVar75 = vmulps_avx512vl(auVar198,auVar88);
    auVar50 = vxorps_avx512vl(auVar82._0_16_,auVar82._0_16_);
    auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar68),_DAT_01feed00,ZEXT1632(auVar50));
    auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01feed00,ZEXT1632(auVar50));
    auVar122._0_4_ = auVar192._0_4_ + auVar68._0_4_;
    auVar122._4_4_ = auVar192._4_4_ + auVar68._4_4_;
    auVar122._8_4_ = auVar192._8_4_ + auVar68._8_4_;
    auVar122._12_4_ = auVar192._12_4_ + auVar68._12_4_;
    auVar122._16_4_ = auVar192._16_4_ + 0.0;
    auVar122._20_4_ = auVar192._20_4_ + 0.0;
    auVar122._24_4_ = auVar192._24_4_ + 0.0;
    auVar122._28_4_ = 0;
    auVar91 = ZEXT1632(auVar50);
    auVar88 = vpermt2ps_avx512vl(auVar192,_DAT_01feed00,auVar91);
    auVar74 = vaddps_avx512vl(ZEXT1632(auVar71),auVar75);
    auVar82 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar91);
    auVar75 = vsubps_avx(auVar80,auVar88);
    auVar82 = vsubps_avx512vl(auVar81,auVar82);
    auVar88 = vmulps_avx512vl(auVar84,auVar87);
    auVar83 = vmulps_avx512vl(auVar89,auVar87);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar78,auVar72);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar78,auVar73);
    auVar72 = vmulps_avx512vl(auVar90,auVar87);
    auVar73 = vmulps_avx512vl(auVar76,auVar87);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar78,auVar84);
    auVar89 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar89);
    auVar73 = vmulps_avx512vl(auVar85,auVar87);
    auVar84 = vmulps_avx512vl(auVar86,auVar87);
    auVar48 = vfmadd231ps_fma(auVar73,auVar78,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar84,auVar78,auVar76);
    auVar73 = vmulps_avx512vl(auVar87,auVar72);
    auVar85 = ZEXT1632(auVar47);
    auVar84 = vmulps_avx512vl(auVar85,auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar88);
    auVar83 = vfmadd231ps_avx512vl(auVar84,auVar78,auVar83);
    auVar90 = vmulps_avx512vl(auVar85,auVar90);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar213 * auVar48._12_4_,
                                            CONCAT48(fVar211 * auVar48._8_4_,
                                                     CONCAT44(fVar214 * auVar48._4_4_,
                                                              fVar212 * auVar48._0_4_)))),auVar78,
                         auVar72);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar78,auVar89);
    auVar29._4_4_ = fVar214 * auVar72._4_4_;
    auVar29._0_4_ = fVar212 * auVar72._0_4_;
    auVar29._8_4_ = fVar211 * auVar72._8_4_;
    auVar29._12_4_ = fVar213 * auVar72._12_4_;
    auVar29._16_4_ = auVar72._16_4_ * 0.0;
    auVar29._20_4_ = auVar72._20_4_ * 0.0;
    auVar29._24_4_ = auVar72._24_4_ * 0.0;
    auVar29._28_4_ = auVar76._28_4_;
    auVar90 = vmulps_avx512vl(auVar85,auVar89);
    auVar76 = vfmadd231ps_avx512vl(auVar29,auVar78,auVar88);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar83,auVar78);
    auVar88 = vsubps_avx512vl(auVar72,auVar88);
    auVar89 = vsubps_avx512vl(auVar89,auVar83);
    auVar88 = vmulps_avx512vl(auVar88,auVar79);
    auVar89 = vmulps_avx512vl(auVar89,auVar79);
    fVar201 = fVar106 * auVar88._0_4_;
    fVar212 = fVar106 * auVar88._4_4_;
    auVar30._4_4_ = fVar212;
    auVar30._0_4_ = fVar201;
    fVar214 = fVar106 * auVar88._8_4_;
    auVar30._8_4_ = fVar214;
    fVar211 = fVar106 * auVar88._12_4_;
    auVar30._12_4_ = fVar211;
    fVar213 = fVar106 * auVar88._16_4_;
    auVar30._16_4_ = fVar213;
    fVar215 = fVar106 * auVar88._20_4_;
    auVar30._20_4_ = fVar215;
    fVar106 = fVar106 * auVar88._24_4_;
    auVar30._24_4_ = fVar106;
    auVar30._28_4_ = auVar88._28_4_;
    auVar89 = vmulps_avx512vl(auVar198,auVar89);
    auVar78 = vpermt2ps_avx512vl(auVar76,_DAT_01feed00,auVar91);
    auVar79 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,auVar91);
    auVar199._0_4_ = auVar76._0_4_ + fVar201;
    auVar199._4_4_ = auVar76._4_4_ + fVar212;
    auVar199._8_4_ = auVar76._8_4_ + fVar214;
    auVar199._12_4_ = auVar76._12_4_ + fVar211;
    auVar199._16_4_ = auVar76._16_4_ + fVar213;
    auVar199._20_4_ = auVar76._20_4_ + fVar215;
    auVar199._24_4_ = auVar76._24_4_ + fVar106;
    auVar199._28_4_ = auVar76._28_4_ + auVar88._28_4_;
    auVar88 = vpermt2ps_avx512vl(auVar30,_DAT_01feed00,ZEXT1632(auVar50));
    auVar83 = vaddps_avx512vl(auVar90,auVar89);
    auVar89 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,ZEXT1632(auVar50));
    auVar88 = vsubps_avx(auVar78,auVar88);
    auVar89 = vsubps_avx512vl(auVar79,auVar89);
    auVar134 = ZEXT1632(auVar68);
    auVar72 = vsubps_avx512vl(auVar76,auVar134);
    auVar147 = ZEXT1632(auVar71);
    auVar73 = vsubps_avx512vl(auVar90,auVar147);
    auVar84 = vsubps_avx512vl(auVar78,auVar80);
    auVar72 = vaddps_avx512vl(auVar72,auVar84);
    auVar84 = vsubps_avx512vl(auVar79,auVar81);
    auVar73 = vaddps_avx512vl(auVar73,auVar84);
    auVar84 = vmulps_avx512vl(auVar147,auVar72);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar134,auVar73);
    auVar85 = vmulps_avx512vl(auVar74,auVar72);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar122,auVar73);
    auVar86 = vmulps_avx512vl(auVar82,auVar72);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar75,auVar73);
    auVar87 = vmulps_avx512vl(auVar81,auVar72);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar80,auVar73);
    auVar91 = vmulps_avx512vl(auVar90,auVar72);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar76,auVar73);
    auVar92 = vmulps_avx512vl(auVar83,auVar72);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar199,auVar73);
    auVar93 = vmulps_avx512vl(auVar89,auVar72);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar88,auVar73);
    auVar72 = vmulps_avx512vl(auVar79,auVar72);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar78,auVar73);
    auVar73 = vminps_avx512vl(auVar84,auVar85);
    auVar84 = vmaxps_avx512vl(auVar84,auVar85);
    auVar85 = vminps_avx512vl(auVar86,auVar87);
    auVar73 = vminps_avx512vl(auVar73,auVar85);
    auVar85 = vmaxps_avx512vl(auVar86,auVar87);
    auVar84 = vmaxps_avx512vl(auVar84,auVar85);
    auVar85 = vminps_avx512vl(auVar91,auVar92);
    auVar86 = vmaxps_avx512vl(auVar91,auVar92);
    auVar87 = vminps_avx512vl(auVar93,auVar72);
    auVar85 = vminps_avx512vl(auVar85,auVar87);
    auVar73 = vminps_avx512vl(auVar73,auVar85);
    auVar72 = vmaxps_avx512vl(auVar93,auVar72);
    auVar72 = vmaxps_avx512vl(auVar86,auVar72);
    auVar72 = vmaxps_avx512vl(auVar84,auVar72);
    uVar17 = vcmpps_avx512vl(auVar73,local_260,2);
    uVar18 = vcmpps_avx512vl(auVar72,auVar77,5);
    bVar35 = (byte)uVar17 & (byte)uVar18 & 0x7f;
    auVar247 = ZEXT3264(auVar77);
    if (bVar35 == 0) {
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    else {
      auVar72 = vsubps_avx512vl(auVar80,auVar134);
      auVar73 = vsubps_avx512vl(auVar81,auVar147);
      auVar84 = vsubps_avx512vl(auVar78,auVar76);
      auVar72 = vaddps_avx512vl(auVar72,auVar84);
      auVar84 = vsubps_avx512vl(auVar79,auVar90);
      auVar73 = vaddps_avx512vl(auVar73,auVar84);
      auVar84 = vmulps_avx512vl(auVar147,auVar72);
      auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar73,auVar134);
      auVar74 = vmulps_avx512vl(auVar74,auVar72);
      auVar74 = vfnmadd213ps_avx512vl(auVar122,auVar73,auVar74);
      auVar82 = vmulps_avx512vl(auVar82,auVar72);
      auVar82 = vfnmadd213ps_avx512vl(auVar75,auVar73,auVar82);
      auVar75 = vmulps_avx512vl(auVar81,auVar72);
      auVar80 = vfnmadd231ps_avx512vl(auVar75,auVar73,auVar80);
      auVar75 = vmulps_avx512vl(auVar90,auVar72);
      auVar76 = vfnmadd231ps_avx512vl(auVar75,auVar73,auVar76);
      auVar75 = vmulps_avx512vl(auVar83,auVar72);
      auVar81 = vfnmadd213ps_avx512vl(auVar199,auVar73,auVar75);
      auVar75 = vmulps_avx512vl(auVar89,auVar72);
      auVar83 = vfnmadd213ps_avx512vl(auVar88,auVar73,auVar75);
      auVar75 = vmulps_avx512vl(auVar79,auVar72);
      auVar78 = vfnmadd231ps_avx512vl(auVar75,auVar78,auVar73);
      auVar88 = vminps_avx(auVar84,auVar74);
      auVar75 = vmaxps_avx(auVar84,auVar74);
      auVar89 = vminps_avx(auVar82,auVar80);
      auVar89 = vminps_avx(auVar88,auVar89);
      auVar88 = vmaxps_avx(auVar82,auVar80);
      auVar75 = vmaxps_avx(auVar75,auVar88);
      auVar90 = vminps_avx(auVar76,auVar81);
      auVar88 = vmaxps_avx(auVar76,auVar81);
      auVar76 = vminps_avx(auVar83,auVar78);
      auVar90 = vminps_avx(auVar90,auVar76);
      auVar90 = vminps_avx(auVar89,auVar90);
      auVar89 = vmaxps_avx(auVar83,auVar78);
      auVar88 = vmaxps_avx(auVar88,auVar89);
      auVar75 = vmaxps_avx(auVar75,auVar88);
      uVar17 = vcmpps_avx512vl(auVar75,auVar77,5);
      uVar18 = vcmpps_avx512vl(auVar90,local_260,2);
      bVar35 = bVar35 & (byte)uVar17 & (byte)uVar18;
      if (bVar35 != 0) {
        auStack_440[uVar31] = (uint)bVar35;
        uVar17 = vmovlps_avx(auVar46);
        (&uStack_240)[uVar31] = uVar17;
        uVar39 = vmovlps_avx(auVar49);
        auStack_1a0[uVar31] = uVar39;
        uVar31 = (ulong)((int)uVar31 + 1);
      }
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar246 = ZEXT3264(_DAT_01feed20);
    auVar245 = ZEXT1664(auVar50);
    auVar244 = ZEXT1664(auVar48);
    auVar243 = ZEXT3264(auVar77);
    auVar242 = ZEXT1664(auVar47);
    auVar241 = ZEXT1664(auVar49);
    auVar240 = ZEXT1664(auVar46);
LAB_01d3a250:
    do {
      do {
        auVar77 = auVar247._0_32_;
        if ((int)uVar31 == 0) {
          if (bVar41) {
            return bVar41;
          }
          uVar114 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar24._4_4_ = uVar114;
          auVar24._0_4_ = uVar114;
          auVar24._8_4_ = uVar114;
          auVar24._12_4_ = uVar114;
          auVar24._16_4_ = uVar114;
          auVar24._20_4_ = uVar114;
          auVar24._24_4_ = uVar114;
          auVar24._28_4_ = uVar114;
          uVar17 = vcmpps_avx512vl(local_1c0,auVar24,2);
          uVar40 = (uint)uVar38 & (uint)uVar17;
          uVar38 = (ulong)uVar40;
          if (uVar40 == 0) {
            return bVar41;
          }
          goto LAB_01d39546;
        }
        uVar36 = (int)uVar31 - 1;
        uVar37 = (ulong)uVar36;
        uVar8 = auStack_440[uVar37];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auStack_1a0[uVar37];
        uVar39 = 0;
        for (uVar33 = (ulong)uVar8; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          uVar39 = uVar39 + 1;
        }
        uVar32 = uVar8 - 1 & uVar8;
        bVar44 = uVar32 == 0;
        auStack_440[uVar37] = uVar32;
        if (bVar44) {
          uVar31 = (ulong)uVar36;
        }
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar39;
        auVar46 = vpunpcklqdq_avx(auVar107,ZEXT416((int)uVar39 + 1));
        auVar46 = vcvtqq2ps_avx512vl(auVar46);
        auVar46 = vmulps_avx512vl(auVar46,auVar244._0_16_);
        uVar114 = *(undefined4 *)((long)&uStack_240 + uVar37 * 8 + 4);
        auVar19._4_4_ = uVar114;
        auVar19._0_4_ = uVar114;
        auVar19._8_4_ = uVar114;
        auVar19._12_4_ = uVar114;
        auVar47 = vmulps_avx512vl(auVar46,auVar19);
        auVar48 = auVar245._0_16_;
        auVar46 = vsubps_avx512vl(auVar48,auVar46);
        uVar114 = *(undefined4 *)(&uStack_240 + uVar37);
        auVar20._4_4_ = uVar114;
        auVar20._0_4_ = uVar114;
        auVar20._8_4_ = uVar114;
        auVar20._12_4_ = uVar114;
        auVar46 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar20);
        auVar47 = vmovshdup_avx(auVar46);
        fVar106 = auVar47._0_4_ - auVar46._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar106));
        if (uVar8 == 0 || bVar44) goto LAB_01d39cb5;
        auVar47 = vshufps_avx(auVar49,auVar49,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar106));
        auVar60 = vsubps_avx512vl(auVar48,auVar47);
        fVar201 = auVar47._0_4_;
        auVar142._0_4_ = fVar201 * fVar111;
        fVar212 = auVar47._4_4_;
        auVar142._4_4_ = fVar212 * fVar112;
        fVar214 = auVar47._8_4_;
        auVar142._8_4_ = fVar214 * fVar111;
        fVar211 = auVar47._12_4_;
        auVar142._12_4_ = fVar211 * fVar112;
        auVar154._0_4_ = fVar201 * fVar113;
        auVar154._4_4_ = fVar212 * fVar123;
        auVar154._8_4_ = fVar214 * fVar113;
        auVar154._12_4_ = fVar211 * fVar123;
        auVar166._0_4_ = fVar137 * fVar201;
        auVar166._4_4_ = fVar138 * fVar212;
        auVar166._8_4_ = fVar137 * fVar214;
        auVar166._12_4_ = fVar138 * fVar211;
        auVar125._0_4_ = fVar139 * fVar201;
        auVar125._4_4_ = fVar200 * fVar212;
        auVar125._8_4_ = fVar139 * fVar214;
        auVar125._12_4_ = fVar200 * fVar211;
        auVar47 = vfmadd231ps_fma(auVar142,auVar60,auVar165);
        auVar50 = vfmadd231ps_fma(auVar154,auVar60,auVar58);
        auVar59 = vfmadd231ps_fma(auVar166,auVar60,auVar57);
        auVar60 = vfmadd231ps_fma(auVar125,auVar115,auVar60);
        auVar135._16_16_ = auVar47;
        auVar135._0_16_ = auVar47;
        auVar148._16_16_ = auVar50;
        auVar148._0_16_ = auVar50;
        auVar158._16_16_ = auVar59;
        auVar158._0_16_ = auVar59;
        auVar88 = vpermps_avx512vl(auVar246._0_32_,ZEXT1632(auVar46));
        auVar75 = vsubps_avx(auVar148,auVar135);
        auVar50 = vfmadd213ps_fma(auVar75,auVar88,auVar135);
        auVar75 = vsubps_avx(auVar158,auVar148);
        auVar68 = vfmadd213ps_fma(auVar75,auVar88,auVar148);
        auVar47 = vsubps_avx(auVar60,auVar59);
        auVar149._16_16_ = auVar47;
        auVar149._0_16_ = auVar47;
        auVar47 = vfmadd213ps_fma(auVar149,auVar88,auVar158);
        auVar75 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar50));
        auVar50 = vfmadd213ps_fma(auVar75,auVar88,ZEXT1632(auVar50));
        auVar75 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar68));
        auVar47 = vfmadd213ps_fma(auVar75,auVar88,ZEXT1632(auVar68));
        auVar75 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar50));
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar75,auVar88);
        auVar75 = vmulps_avx512vl(auVar75,auVar243._0_32_);
        auVar95._16_16_ = auVar75._16_16_;
        fVar201 = fVar106 * 0.33333334;
        auVar167._0_8_ =
             CONCAT44(auVar140._4_4_ + fVar201 * auVar75._4_4_,
                      auVar140._0_4_ + fVar201 * auVar75._0_4_);
        auVar167._8_4_ = auVar140._8_4_ + fVar201 * auVar75._8_4_;
        auVar167._12_4_ = auVar140._12_4_ + fVar201 * auVar75._12_4_;
        auVar143._0_4_ = fVar201 * auVar75._16_4_;
        auVar143._4_4_ = fVar201 * auVar75._20_4_;
        auVar143._8_4_ = fVar201 * auVar75._24_4_;
        auVar143._12_4_ = fVar201 * auVar75._28_4_;
        auVar67 = vsubps_avx((undefined1  [16])0x0,auVar143);
        auVar68 = vshufpd_avx(auVar140,auVar140,3);
        auVar71 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar47 = vsubps_avx(auVar68,auVar140);
        auVar50 = vsubps_avx(auVar71,(undefined1  [16])0x0);
        auVar184._0_4_ = auVar47._0_4_ + auVar50._0_4_;
        auVar184._4_4_ = auVar47._4_4_ + auVar50._4_4_;
        auVar184._8_4_ = auVar47._8_4_ + auVar50._8_4_;
        auVar184._12_4_ = auVar47._12_4_ + auVar50._12_4_;
        auVar47 = vshufps_avx(auVar140,auVar140,0xb1);
        auVar50 = vshufps_avx(auVar167,auVar167,0xb1);
        auVar59 = vshufps_avx(auVar67,auVar67,0xb1);
        auVar60 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar232._4_4_ = auVar184._0_4_;
        auVar232._0_4_ = auVar184._0_4_;
        auVar232._8_4_ = auVar184._0_4_;
        auVar232._12_4_ = auVar184._0_4_;
        auVar63 = vshufps_avx(auVar184,auVar184,0x55);
        fVar201 = auVar63._0_4_;
        auVar195._0_4_ = auVar47._0_4_ * fVar201;
        fVar212 = auVar63._4_4_;
        auVar195._4_4_ = auVar47._4_4_ * fVar212;
        fVar214 = auVar63._8_4_;
        auVar195._8_4_ = auVar47._8_4_ * fVar214;
        fVar211 = auVar63._12_4_;
        auVar195._12_4_ = auVar47._12_4_ * fVar211;
        auVar203._0_4_ = auVar50._0_4_ * fVar201;
        auVar203._4_4_ = auVar50._4_4_ * fVar212;
        auVar203._8_4_ = auVar50._8_4_ * fVar214;
        auVar203._12_4_ = auVar50._12_4_ * fVar211;
        auVar218._0_4_ = auVar59._0_4_ * fVar201;
        auVar218._4_4_ = auVar59._4_4_ * fVar212;
        auVar218._8_4_ = auVar59._8_4_ * fVar214;
        auVar218._12_4_ = auVar59._12_4_ * fVar211;
        auVar185._0_4_ = auVar60._0_4_ * fVar201;
        auVar185._4_4_ = auVar60._4_4_ * fVar212;
        auVar185._8_4_ = auVar60._8_4_ * fVar214;
        auVar185._12_4_ = auVar60._12_4_ * fVar211;
        auVar47 = vfmadd231ps_fma(auVar195,auVar232,auVar140);
        auVar50 = vfmadd231ps_fma(auVar203,auVar232,auVar167);
        auVar65 = vfmadd231ps_fma(auVar218,auVar232,auVar67);
        auVar66 = vfmadd231ps_fma(auVar185,(undefined1  [16])0x0,auVar232);
        auVar63 = vshufpd_avx(auVar47,auVar47,1);
        auVar64 = vshufpd_avx(auVar50,auVar50,1);
        auVar61 = vshufpd_avx512vl(auVar65,auVar65,1);
        auVar62 = vshufpd_avx512vl(auVar66,auVar66,1);
        auVar59 = vminss_avx(auVar47,auVar50);
        auVar47 = vmaxss_avx(auVar50,auVar47);
        auVar60 = vminss_avx(auVar65,auVar66);
        auVar50 = vmaxss_avx(auVar66,auVar65);
        auVar59 = vminss_avx(auVar59,auVar60);
        auVar47 = vmaxss_avx(auVar50,auVar47);
        auVar60 = vminss_avx(auVar63,auVar64);
        auVar50 = vmaxss_avx(auVar64,auVar63);
        auVar63 = vminss_avx512f(auVar61,auVar62);
        auVar64 = vmaxss_avx512f(auVar62,auVar61);
        auVar50 = vmaxss_avx(auVar64,auVar50);
        auVar60 = vminss_avx512f(auVar60,auVar63);
        fVar212 = auVar50._0_4_;
        fVar201 = auVar47._0_4_;
        if (auVar59._0_4_ < 0.0001) {
          bVar45 = fVar212 == -0.0001;
          bVar42 = NAN(fVar212);
          if (fVar212 <= -0.0001) goto LAB_01d3a47c;
          break;
        }
LAB_01d3a47c:
        vucomiss_avx512f(auVar60);
        bVar45 = fVar212 <= -0.0001;
        bVar43 = -0.0001 < fVar201;
        bVar42 = bVar45;
        if (!bVar45) break;
        uVar17 = vcmpps_avx512vl(auVar59,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar18 = vcmpps_avx512vl(auVar60,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar35 = (byte)uVar17 & (byte)uVar18 & 1;
        bVar45 = bVar43 && bVar35 == 0;
        bVar42 = bVar43 && bVar35 == 0;
      } while (!bVar43 || bVar35 != 0);
      auVar65 = auVar248._0_16_;
      vcmpss_avx512f(auVar59,auVar65,1);
      uVar17 = vcmpss_avx512f(auVar47,auVar65,1);
      bVar43 = (bool)((byte)uVar17 & 1);
      auVar95._0_16_ = auVar249._0_16_;
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (float)((uint)bVar43 * -0x40800000 + (uint)!bVar43 * auVar249._0_4_);
      vucomiss_avx512f(auVar94._0_16_);
      bVar42 = (bool)(!bVar45 | bVar42);
      bVar43 = bVar42 == false;
      auVar97._16_16_ = auVar95._16_16_;
      auVar97._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (uint)bVar42 * auVar248._0_4_ + (uint)!bVar42 * 0x7f800000;
      auVar64 = auVar96._0_16_;
      auVar99._16_16_ = auVar95._16_16_;
      auVar99._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar98._4_28_ = auVar99._4_28_;
      auVar98._0_4_ = (uint)bVar42 * auVar248._0_4_ + (uint)!bVar42 * -0x800000;
      auVar63 = auVar98._0_16_;
      uVar17 = vcmpss_avx512f(auVar60,auVar65,1);
      bVar45 = (bool)((byte)uVar17 & 1);
      auVar101._16_16_ = auVar95._16_16_;
      auVar101._0_16_ = auVar249._0_16_;
      auVar100._4_28_ = auVar101._4_28_;
      auVar100._0_4_ = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * auVar249._0_4_);
      vucomiss_avx512f(auVar100._0_16_);
      if ((bVar42) || (bVar43)) {
        auVar60 = vucomiss_avx512f(auVar59);
        if ((bVar42) || (bVar43)) {
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = 0x8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar66 = vxorps_avx512vl(auVar59,auVar23);
          auVar59 = vsubss_avx512f(auVar60,auVar59);
          auVar59 = vdivss_avx512f(auVar66,auVar59);
          auVar60 = vsubss_avx512f(ZEXT416(0x3f800000),auVar59);
          auVar60 = vfmadd213ss_avx512f(auVar60,auVar65,auVar59);
          auVar59 = auVar60;
        }
        else {
          auVar59 = vxorps_avx512vl(auVar60,auVar60);
          vucomiss_avx512f(auVar59);
          auVar60 = ZEXT416(0x3f800000);
          if ((bVar42) || (bVar43)) {
            auVar60 = SUB6416(ZEXT464(0xff800000),0);
            auVar59 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar64 = vminss_avx512f(auVar64,auVar59);
        auVar63 = vmaxss_avx(auVar60,auVar63);
      }
      auVar249 = ZEXT464(0x3f800000);
      uVar17 = vcmpss_avx512f(auVar50,auVar65,1);
      bVar45 = (bool)((byte)uVar17 & 1);
      auVar50 = auVar249._0_16_;
      fVar214 = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * 0x3f800000);
      if ((auVar94._0_4_ != fVar214) || (NAN(auVar94._0_4_) || NAN(fVar214))) {
        if ((fVar212 != fVar201) || (NAN(fVar212) || NAN(fVar201))) {
          auVar22._8_4_ = 0x80000000;
          auVar22._0_8_ = 0x8000000080000000;
          auVar22._12_4_ = 0x80000000;
          auVar47 = vxorps_avx512vl(auVar47,auVar22);
          auVar186._0_4_ = auVar47._0_4_ / (fVar212 - fVar201);
          auVar186._4_12_ = auVar47._4_12_;
          auVar47 = vsubss_avx512f(auVar50,auVar186);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar65,auVar186);
          auVar59 = auVar47;
        }
        else if ((fVar201 != 0.0) ||
                (auVar47 = auVar50, auVar59 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar201))) {
          auVar47 = SUB6416(ZEXT464(0xff800000),0);
          auVar59 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar64 = vminss_avx(auVar64,auVar59);
        auVar63 = vmaxss_avx(auVar47,auVar63);
      }
      bVar45 = auVar100._0_4_ != fVar214;
      auVar47 = vminss_avx512f(auVar64,auVar50);
      auVar103._16_16_ = auVar95._16_16_;
      auVar103._0_16_ = auVar64;
      auVar102._4_28_ = auVar103._4_28_;
      auVar102._0_4_ = (uint)bVar45 * auVar47._0_4_ + (uint)!bVar45 * auVar64._0_4_;
      auVar47 = vmaxss_avx512f(auVar50,auVar63);
      auVar105._16_16_ = auVar95._16_16_;
      auVar105._0_16_ = auVar63;
      auVar104._4_28_ = auVar105._4_28_;
      auVar104._0_4_ = (uint)bVar45 * auVar47._0_4_ + (uint)!bVar45 * auVar63._0_4_;
      auVar47 = vmaxss_avx512f(auVar65,auVar102._0_16_);
      auVar59 = vminss_avx512f(auVar104._0_16_,auVar50);
    } while (auVar59._0_4_ < auVar47._0_4_);
    auVar65 = vmaxss_avx512f(auVar65,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
    auVar66 = vminss_avx512f(ZEXT416((uint)(auVar59._0_4_ + 0.1)),auVar50);
    auVar126._0_8_ = auVar140._0_8_;
    auVar126._8_8_ = auVar126._0_8_;
    auVar204._8_8_ = auVar167._0_8_;
    auVar204._0_8_ = auVar167._0_8_;
    auVar219._8_8_ = auVar67._0_8_;
    auVar219._0_8_ = auVar67._0_8_;
    auVar47 = vshufpd_avx(auVar167,auVar167,3);
    auVar59 = vshufpd_avx(auVar67,auVar67,3);
    auVar60 = vshufps_avx(auVar65,auVar66,0);
    auVar64 = vsubps_avx512vl(auVar48,auVar60);
    fVar201 = auVar60._0_4_;
    auVar155._0_4_ = fVar201 * auVar68._0_4_;
    fVar212 = auVar60._4_4_;
    auVar155._4_4_ = fVar212 * auVar68._4_4_;
    fVar214 = auVar60._8_4_;
    auVar155._8_4_ = fVar214 * auVar68._8_4_;
    fVar211 = auVar60._12_4_;
    auVar155._12_4_ = fVar211 * auVar68._12_4_;
    auVar168._0_4_ = fVar201 * auVar47._0_4_;
    auVar168._4_4_ = fVar212 * auVar47._4_4_;
    auVar168._8_4_ = fVar214 * auVar47._8_4_;
    auVar168._12_4_ = fVar211 * auVar47._12_4_;
    auVar235._0_4_ = auVar59._0_4_ * fVar201;
    auVar235._4_4_ = auVar59._4_4_ * fVar212;
    auVar235._8_4_ = auVar59._8_4_ * fVar214;
    auVar235._12_4_ = auVar59._12_4_ * fVar211;
    auVar144._0_4_ = fVar201 * auVar71._0_4_;
    auVar144._4_4_ = fVar212 * auVar71._4_4_;
    auVar144._8_4_ = fVar214 * auVar71._8_4_;
    auVar144._12_4_ = fVar211 * auVar71._12_4_;
    auVar68 = vfmadd231ps_fma(auVar155,auVar64,auVar126);
    auVar71 = vfmadd231ps_fma(auVar168,auVar64,auVar204);
    auVar63 = vfmadd231ps_fma(auVar235,auVar64,auVar219);
    auVar64 = vfmadd231ps_fma(auVar144,auVar64,ZEXT816(0));
    auVar59 = vsubss_avx512f(auVar50,auVar65);
    auVar47 = vmovshdup_avx(auVar49);
    auVar140 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar65._0_4_)),auVar49,auVar59);
    auVar59 = vsubss_avx512f(auVar50,auVar66);
    auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar66._0_4_)),auVar49,auVar59);
    auVar67 = vdivss_avx512f(auVar50,ZEXT416((uint)fVar106));
    auVar49 = vsubps_avx(auVar71,auVar68);
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar59 = vmulps_avx512vl(auVar49,auVar65);
    auVar49 = vsubps_avx(auVar63,auVar71);
    auVar60 = vmulps_avx512vl(auVar49,auVar65);
    auVar49 = vsubps_avx(auVar64,auVar63);
    auVar49 = vmulps_avx512vl(auVar49,auVar65);
    auVar47 = vminps_avx(auVar60,auVar49);
    auVar49 = vmaxps_avx(auVar60,auVar49);
    auVar47 = vminps_avx(auVar59,auVar47);
    auVar49 = vmaxps_avx(auVar59,auVar49);
    auVar59 = vshufpd_avx(auVar47,auVar47,3);
    auVar60 = vshufpd_avx(auVar49,auVar49,3);
    auVar47 = vminps_avx(auVar47,auVar59);
    auVar49 = vmaxps_avx(auVar49,auVar60);
    fVar106 = auVar67._0_4_;
    auVar187._0_4_ = auVar47._0_4_ * fVar106;
    auVar187._4_4_ = auVar47._4_4_ * fVar106;
    auVar187._8_4_ = auVar47._8_4_ * fVar106;
    auVar187._12_4_ = auVar47._12_4_ * fVar106;
    auVar175._0_4_ = fVar106 * auVar49._0_4_;
    auVar175._4_4_ = fVar106 * auVar49._4_4_;
    auVar175._8_4_ = fVar106 * auVar49._8_4_;
    auVar175._12_4_ = fVar106 * auVar49._12_4_;
    auVar67 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar61._0_4_ - auVar140._0_4_)));
    auVar49 = vshufpd_avx(auVar68,auVar68,3);
    auVar47 = vshufpd_avx(auVar71,auVar71,3);
    auVar59 = vshufpd_avx(auVar63,auVar63,3);
    auVar60 = vshufpd_avx(auVar64,auVar64,3);
    auVar49 = vsubps_avx(auVar49,auVar68);
    auVar68 = vsubps_avx(auVar47,auVar71);
    auVar71 = vsubps_avx(auVar59,auVar63);
    auVar60 = vsubps_avx(auVar60,auVar64);
    auVar47 = vminps_avx(auVar49,auVar68);
    auVar49 = vmaxps_avx(auVar49,auVar68);
    auVar59 = vminps_avx(auVar71,auVar60);
    auVar59 = vminps_avx(auVar47,auVar59);
    auVar47 = vmaxps_avx(auVar71,auVar60);
    auVar49 = vmaxps_avx(auVar49,auVar47);
    fVar106 = auVar67._0_4_;
    auVar220._0_4_ = fVar106 * auVar59._0_4_;
    auVar220._4_4_ = fVar106 * auVar59._4_4_;
    auVar220._8_4_ = fVar106 * auVar59._8_4_;
    auVar220._12_4_ = fVar106 * auVar59._12_4_;
    auVar205._0_4_ = fVar106 * auVar49._0_4_;
    auVar205._4_4_ = fVar106 * auVar49._4_4_;
    auVar205._8_4_ = fVar106 * auVar49._8_4_;
    auVar205._12_4_ = fVar106 * auVar49._12_4_;
    auVar60 = vinsertps_avx(auVar46,auVar140,0x10);
    auVar62 = vpermt2ps_avx512vl(auVar46,_DAT_01feecd0,auVar61);
    auVar116._0_4_ = auVar60._0_4_ + auVar62._0_4_;
    auVar116._4_4_ = auVar60._4_4_ + auVar62._4_4_;
    auVar116._8_4_ = auVar60._8_4_ + auVar62._8_4_;
    auVar116._12_4_ = auVar60._12_4_ + auVar62._12_4_;
    auVar67 = vmulps_avx512vl(auVar116,auVar241._0_16_);
    auVar47 = vshufps_avx(auVar67,auVar67,0x54);
    uVar114 = auVar67._0_4_;
    auVar118._4_4_ = uVar114;
    auVar118._0_4_ = uVar114;
    auVar118._8_4_ = uVar114;
    auVar118._12_4_ = uVar114;
    auVar59 = vfmadd213ps_fma(auVar56,auVar118,auVar4);
    auVar68 = vfmadd213ps_fma(local_270,auVar118,auVar55);
    auVar71 = vfmadd213ps_fma(local_280,auVar118,auVar5);
    auVar49 = vsubps_avx(auVar68,auVar59);
    auVar59 = vfmadd213ps_fma(auVar49,auVar118,auVar59);
    auVar49 = vsubps_avx(auVar71,auVar68);
    auVar49 = vfmadd213ps_fma(auVar49,auVar118,auVar68);
    auVar49 = vsubps_avx(auVar49,auVar59);
    auVar59 = vfmadd231ps_fma(auVar59,auVar49,auVar118);
    auVar63 = vmulps_avx512vl(auVar49,auVar65);
    auVar228._8_8_ = auVar59._0_8_;
    auVar228._0_8_ = auVar59._0_8_;
    auVar49 = vshufpd_avx(auVar59,auVar59,3);
    auVar59 = vshufps_avx(auVar67,auVar67,0x55);
    auVar68 = vsubps_avx(auVar49,auVar228);
    auVar71 = vfmadd231ps_fma(auVar228,auVar59,auVar68);
    auVar236._8_8_ = auVar63._0_8_;
    auVar236._0_8_ = auVar63._0_8_;
    auVar49 = vshufpd_avx(auVar63,auVar63,3);
    auVar49 = vsubps_avx512vl(auVar49,auVar236);
    auVar49 = vfmadd213ps_avx512vl(auVar49,auVar59,auVar236);
    auVar59 = vxorps_avx512vl(auVar68,auVar240._0_16_);
    auVar63 = vmovshdup_avx512vl(auVar49);
    auVar64 = vxorps_avx512vl(auVar63,auVar240._0_16_);
    auVar65 = vmovshdup_avx512vl(auVar68);
    auVar64 = vpermt2ps_avx512vl(auVar64,ZEXT416(5),auVar68);
    auVar68 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar63._0_4_ * auVar68._0_4_)),auVar49,auVar65);
    auVar59 = vpermt2ps_avx512vl(auVar49,SUB6416(ZEXT464(4),0),auVar59);
    auVar145._0_4_ = auVar68._0_4_;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    auVar49 = vdivps_avx(auVar64,auVar145);
    auVar69 = vdivps_avx512vl(auVar59,auVar145);
    fVar106 = auVar71._0_4_;
    auVar59 = vshufps_avx(auVar71,auVar71,0x55);
    auVar229._0_4_ = fVar106 * auVar49._0_4_ + auVar59._0_4_ * auVar69._0_4_;
    auVar229._4_4_ = fVar106 * auVar49._4_4_ + auVar59._4_4_ * auVar69._4_4_;
    auVar229._8_4_ = fVar106 * auVar49._8_4_ + auVar59._8_4_ * auVar69._8_4_;
    auVar229._12_4_ = fVar106 * auVar49._12_4_ + auVar59._12_4_ * auVar69._12_4_;
    auVar65 = vsubps_avx(auVar47,auVar229);
    auVar59 = vmovshdup_avx(auVar49);
    auVar47 = vinsertps_avx(auVar187,auVar220,0x1c);
    auVar237._0_4_ = auVar59._0_4_ * auVar47._0_4_;
    auVar237._4_4_ = auVar59._4_4_ * auVar47._4_4_;
    auVar237._8_4_ = auVar59._8_4_ * auVar47._8_4_;
    auVar237._12_4_ = auVar59._12_4_ * auVar47._12_4_;
    auVar66 = vinsertps_avx512f(auVar175,auVar205,0x1c);
    auVar59 = vmulps_avx512vl(auVar59,auVar66);
    auVar64 = vminps_avx512vl(auVar237,auVar59);
    auVar71 = vmaxps_avx(auVar59,auVar237);
    auVar63 = vmovshdup_avx(auVar69);
    auVar59 = vinsertps_avx(auVar220,auVar187,0x4c);
    auVar221._0_4_ = auVar63._0_4_ * auVar59._0_4_;
    auVar221._4_4_ = auVar63._4_4_ * auVar59._4_4_;
    auVar221._8_4_ = auVar63._8_4_ * auVar59._8_4_;
    auVar221._12_4_ = auVar63._12_4_ * auVar59._12_4_;
    auVar68 = vinsertps_avx(auVar205,auVar175,0x4c);
    auVar206._0_4_ = auVar63._0_4_ * auVar68._0_4_;
    auVar206._4_4_ = auVar63._4_4_ * auVar68._4_4_;
    auVar206._8_4_ = auVar63._8_4_ * auVar68._8_4_;
    auVar206._12_4_ = auVar63._12_4_ * auVar68._12_4_;
    auVar63 = vminps_avx(auVar221,auVar206);
    auVar64 = vaddps_avx512vl(auVar64,auVar63);
    auVar63 = vmaxps_avx(auVar206,auVar221);
    auVar207._0_4_ = auVar71._0_4_ + auVar63._0_4_;
    auVar207._4_4_ = auVar71._4_4_ + auVar63._4_4_;
    auVar207._8_4_ = auVar71._8_4_ + auVar63._8_4_;
    auVar207._12_4_ = auVar71._12_4_ + auVar63._12_4_;
    auVar222._8_8_ = 0x3f80000000000000;
    auVar222._0_8_ = 0x3f80000000000000;
    auVar71 = vsubps_avx(auVar222,auVar207);
    auVar63 = vsubps_avx(auVar222,auVar64);
    auVar64 = vsubps_avx(auVar60,auVar67);
    auVar67 = vsubps_avx(auVar62,auVar67);
    fVar211 = auVar64._0_4_;
    auVar238._0_4_ = fVar211 * auVar71._0_4_;
    fVar213 = auVar64._4_4_;
    auVar238._4_4_ = fVar213 * auVar71._4_4_;
    fVar215 = auVar64._8_4_;
    auVar238._8_4_ = fVar215 * auVar71._8_4_;
    fVar216 = auVar64._12_4_;
    auVar238._12_4_ = fVar216 * auVar71._12_4_;
    auVar70 = vbroadcastss_avx512vl(auVar49);
    auVar47 = vmulps_avx512vl(auVar70,auVar47);
    auVar66 = vmulps_avx512vl(auVar70,auVar66);
    auVar70 = vminps_avx512vl(auVar47,auVar66);
    auVar66 = vmaxps_avx512vl(auVar66,auVar47);
    auVar47 = vbroadcastss_avx512vl(auVar69);
    auVar59 = vmulps_avx512vl(auVar47,auVar59);
    auVar47 = vmulps_avx512vl(auVar47,auVar68);
    auVar68 = vminps_avx512vl(auVar59,auVar47);
    auVar68 = vaddps_avx512vl(auVar70,auVar68);
    auVar64 = vmulps_avx512vl(auVar64,auVar63);
    fVar106 = auVar67._0_4_;
    auVar208._0_4_ = fVar106 * auVar71._0_4_;
    fVar201 = auVar67._4_4_;
    auVar208._4_4_ = fVar201 * auVar71._4_4_;
    fVar212 = auVar67._8_4_;
    auVar208._8_4_ = fVar212 * auVar71._8_4_;
    fVar214 = auVar67._12_4_;
    auVar208._12_4_ = fVar214 * auVar71._12_4_;
    auVar223._0_4_ = fVar106 * auVar63._0_4_;
    auVar223._4_4_ = fVar201 * auVar63._4_4_;
    auVar223._8_4_ = fVar212 * auVar63._8_4_;
    auVar223._12_4_ = fVar214 * auVar63._12_4_;
    auVar47 = vmaxps_avx(auVar47,auVar59);
    auVar176._0_4_ = auVar66._0_4_ + auVar47._0_4_;
    auVar176._4_4_ = auVar66._4_4_ + auVar47._4_4_;
    auVar176._8_4_ = auVar66._8_4_ + auVar47._8_4_;
    auVar176._12_4_ = auVar66._12_4_ + auVar47._12_4_;
    auVar188._8_8_ = 0x3f800000;
    auVar188._0_8_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar188,auVar176);
    auVar59 = vsubps_avx512vl(auVar188,auVar68);
    auVar233._0_4_ = fVar211 * auVar47._0_4_;
    auVar233._4_4_ = fVar213 * auVar47._4_4_;
    auVar233._8_4_ = fVar215 * auVar47._8_4_;
    auVar233._12_4_ = fVar216 * auVar47._12_4_;
    auVar230._0_4_ = fVar211 * auVar59._0_4_;
    auVar230._4_4_ = fVar213 * auVar59._4_4_;
    auVar230._8_4_ = fVar215 * auVar59._8_4_;
    auVar230._12_4_ = fVar216 * auVar59._12_4_;
    auVar177._0_4_ = fVar106 * auVar47._0_4_;
    auVar177._4_4_ = fVar201 * auVar47._4_4_;
    auVar177._8_4_ = fVar212 * auVar47._8_4_;
    auVar177._12_4_ = fVar214 * auVar47._12_4_;
    auVar189._0_4_ = fVar106 * auVar59._0_4_;
    auVar189._4_4_ = fVar201 * auVar59._4_4_;
    auVar189._8_4_ = fVar212 * auVar59._8_4_;
    auVar189._12_4_ = fVar214 * auVar59._12_4_;
    auVar47 = vminps_avx(auVar233,auVar230);
    auVar59 = vminps_avx512vl(auVar177,auVar189);
    auVar68 = vminps_avx512vl(auVar47,auVar59);
    auVar47 = vmaxps_avx(auVar230,auVar233);
    auVar59 = vmaxps_avx(auVar189,auVar177);
    auVar59 = vmaxps_avx(auVar59,auVar47);
    auVar71 = vminps_avx512vl(auVar238,auVar64);
    auVar47 = vminps_avx(auVar208,auVar223);
    auVar47 = vminps_avx(auVar71,auVar47);
    auVar47 = vhaddps_avx(auVar68,auVar47);
    auVar71 = vmaxps_avx512vl(auVar64,auVar238);
    auVar68 = vmaxps_avx(auVar223,auVar208);
    auVar68 = vmaxps_avx(auVar68,auVar71);
    auVar59 = vhaddps_avx(auVar59,auVar68);
    auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
    auVar59 = vshufps_avx(auVar59,auVar59,0xe8);
    auVar178._0_4_ = auVar47._0_4_ + auVar65._0_4_;
    auVar178._4_4_ = auVar47._4_4_ + auVar65._4_4_;
    auVar178._8_4_ = auVar47._8_4_ + auVar65._8_4_;
    auVar178._12_4_ = auVar47._12_4_ + auVar65._12_4_;
    auVar190._0_4_ = auVar59._0_4_ + auVar65._0_4_;
    auVar190._4_4_ = auVar59._4_4_ + auVar65._4_4_;
    auVar190._8_4_ = auVar59._8_4_ + auVar65._8_4_;
    auVar190._12_4_ = auVar59._12_4_ + auVar65._12_4_;
    auVar47 = vmaxps_avx(auVar60,auVar178);
    auVar59 = vminps_avx(auVar190,auVar62);
    uVar39 = vcmpps_avx512vl(auVar59,auVar47,1);
    auVar47 = ZEXT416(5);
    if ((uVar39 & 3) != 0) {
      auVar46 = vxorps_avx512vl(ZEXT416(5),auVar47);
      auVar248 = ZEXT1664(auVar46);
      goto LAB_01d3a250;
    }
    uVar39 = vcmpps_avx512vl(auVar190,auVar62,1);
    uVar17 = vcmpps_avx512vl(auVar46,auVar178,1);
    if (((ushort)uVar17 & (ushort)uVar39 & 1) == 0) {
      bVar35 = 0;
    }
    else {
      auVar59 = vmovshdup_avx(auVar178);
      bVar35 = auVar140._0_4_ < auVar59._0_4_ & (byte)(uVar39 >> 1) & 0x7f;
    }
    auVar47 = vxorps_avx512vl(auVar47,auVar47);
    auVar248 = ZEXT1664(auVar47);
    local_450 = auVar54._0_4_;
    fStack_44c = auVar54._4_4_;
    fStack_448 = auVar54._8_4_;
    fStack_444 = auVar54._12_4_;
    if (((3 < (uint)uVar31 || uVar8 != 0 && !bVar44) | bVar35) == 1) {
      lVar34 = 200;
      do {
        auVar46 = vsubss_avx512f(auVar50,auVar65);
        fVar212 = auVar46._0_4_;
        fVar106 = fVar212 * fVar212 * fVar212;
        fVar214 = auVar65._0_4_;
        fVar201 = fVar214 * 3.0 * fVar212 * fVar212;
        fVar212 = fVar212 * fVar214 * fVar214 * 3.0;
        auVar132._4_4_ = fVar106;
        auVar132._0_4_ = fVar106;
        auVar132._8_4_ = fVar106;
        auVar132._12_4_ = fVar106;
        auVar127._4_4_ = fVar201;
        auVar127._0_4_ = fVar201;
        auVar127._8_4_ = fVar201;
        auVar127._12_4_ = fVar201;
        auVar108._4_4_ = fVar212;
        auVar108._0_4_ = fVar212;
        auVar108._8_4_ = fVar212;
        auVar108._12_4_ = fVar212;
        fVar214 = fVar214 * fVar214 * fVar214;
        auVar156._0_4_ = local_450 * fVar214;
        auVar156._4_4_ = fStack_44c * fVar214;
        auVar156._8_4_ = fStack_448 * fVar214;
        auVar156._12_4_ = fStack_444 * fVar214;
        auVar46 = vfmadd231ps_fma(auVar156,auVar5,auVar108);
        auVar46 = vfmadd231ps_fma(auVar46,auVar55,auVar127);
        auVar46 = vfmadd231ps_fma(auVar46,auVar4,auVar132);
        auVar109._8_8_ = auVar46._0_8_;
        auVar109._0_8_ = auVar46._0_8_;
        auVar46 = vshufpd_avx(auVar46,auVar46,3);
        auVar59 = vshufps_avx(auVar65,auVar65,0x55);
        auVar46 = vsubps_avx(auVar46,auVar109);
        auVar59 = vfmadd213ps_fma(auVar46,auVar59,auVar109);
        fVar106 = auVar59._0_4_;
        auVar46 = vshufps_avx(auVar59,auVar59,0x55);
        auVar110._0_4_ = auVar49._0_4_ * fVar106 + auVar69._0_4_ * auVar46._0_4_;
        auVar110._4_4_ = auVar49._4_4_ * fVar106 + auVar69._4_4_ * auVar46._4_4_;
        auVar110._8_4_ = auVar49._8_4_ * fVar106 + auVar69._8_4_ * auVar46._8_4_;
        auVar110._12_4_ = auVar49._12_4_ * fVar106 + auVar69._12_4_ * auVar46._12_4_;
        auVar65 = vsubps_avx(auVar65,auVar110);
        auVar46 = vandps_avx512vl(auVar59,auVar242._0_16_);
        auVar59 = vprolq_avx512vl(auVar46,0x20);
        auVar46 = vmaxss_avx(auVar59,auVar46);
        bVar44 = auVar46._0_4_ <= fVar124;
        if (auVar46._0_4_ < fVar124) {
          auVar46 = vucomiss_avx512f(auVar47);
          if (bVar44) {
            auVar49 = vucomiss_avx512f(auVar46);
            auVar249 = ZEXT1664(auVar49);
            if (bVar44) {
              vmovshdup_avx(auVar46);
              auVar49 = vucomiss_avx512f(auVar47);
              if (bVar44) {
                auVar50 = vucomiss_avx512f(auVar49);
                auVar249 = ZEXT1664(auVar50);
                if (bVar44) {
                  auVar59 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar65 = vinsertps_avx(auVar59,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar59 = vdpps_avx(auVar65,local_290,0x7f);
                  auVar60 = vdpps_avx(auVar65,local_2a0,0x7f);
                  auVar68 = vdpps_avx(auVar65,local_2b0,0x7f);
                  auVar71 = vdpps_avx(auVar65,local_2c0,0x7f);
                  auVar63 = vdpps_avx(auVar65,local_2d0,0x7f);
                  auVar64 = vdpps_avx(auVar65,local_2e0,0x7f);
                  auVar67 = vdpps_avx(auVar65,local_2f0,0x7f);
                  auVar65 = vdpps_avx(auVar65,local_300,0x7f);
                  auVar66 = vsubss_avx512f(auVar50,auVar49);
                  fVar106 = auVar49._0_4_;
                  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * auVar63._0_4_)),auVar66,auVar59
                                           );
                  auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * fVar106)),auVar66,auVar60
                                           );
                  auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar106)),auVar66,auVar68
                                           );
                  auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * auVar65._0_4_)),auVar66,auVar71
                                           );
                  auVar50 = vsubss_avx512f(auVar50,auVar46);
                  auVar157._0_4_ = auVar50._0_4_;
                  fVar106 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
                  local_120 = auVar46._0_4_;
                  fVar201 = local_120 * 3.0 * auVar157._0_4_ * auVar157._0_4_;
                  fVar212 = auVar157._0_4_ * local_120 * local_120 * 3.0;
                  fVar214 = local_120 * local_120 * local_120;
                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar68._0_4_)),
                                            ZEXT416((uint)fVar212),auVar60);
                  auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar201),auVar59);
                  vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar106),auVar49);
                  auVar49 = vucomiss_avx512f(ZEXT416(uVar1));
                  if (bVar44) {
                    fVar211 = *(float *)(ray + k * 4 + 0x100);
                    if (auVar49._0_4_ <= fVar211) {
                      auVar50 = vshufps_avx(auVar46,auVar46,0x55);
                      auVar60 = vsubps_avx512vl(auVar48,auVar50);
                      fVar213 = auVar50._0_4_;
                      auVar191._0_4_ = fVar213 * (float)local_320._0_4_;
                      fVar215 = auVar50._4_4_;
                      auVar191._4_4_ = fVar215 * (float)local_320._4_4_;
                      fVar216 = auVar50._8_4_;
                      auVar191._8_4_ = fVar216 * fStack_318;
                      fVar224 = auVar50._12_4_;
                      auVar191._12_4_ = fVar224 * fStack_314;
                      auVar196._0_4_ = fVar213 * (float)local_370._0_4_;
                      auVar196._4_4_ = fVar215 * (float)local_370._4_4_;
                      auVar196._8_4_ = fVar216 * fStack_368;
                      auVar196._12_4_ = fVar224 * fStack_364;
                      auVar209._0_4_ = fVar213 * (float)local_380._0_4_;
                      auVar209._4_4_ = fVar215 * (float)local_380._4_4_;
                      auVar209._8_4_ = fVar216 * fStack_378;
                      auVar209._12_4_ = fVar224 * fStack_374;
                      auVar169._0_4_ = fVar213 * (float)local_340._0_4_;
                      auVar169._4_4_ = fVar215 * (float)local_340._4_4_;
                      auVar169._8_4_ = fVar216 * fStack_338;
                      auVar169._12_4_ = fVar224 * fStack_334;
                      auVar48 = vfmadd231ps_fma(auVar191,auVar60,local_310);
                      auVar50 = vfmadd231ps_fma(auVar196,auVar60,local_350);
                      auVar59 = vfmadd231ps_fma(auVar209,auVar60,local_360);
                      auVar60 = vfmadd231ps_fma(auVar169,auVar60,local_330);
                      auVar48 = vsubps_avx(auVar50,auVar48);
                      auVar50 = vsubps_avx(auVar59,auVar50);
                      auVar59 = vsubps_avx(auVar60,auVar59);
                      auVar210._0_4_ = local_120 * auVar50._0_4_;
                      auVar210._4_4_ = local_120 * auVar50._4_4_;
                      auVar210._8_4_ = local_120 * auVar50._8_4_;
                      auVar210._12_4_ = local_120 * auVar50._12_4_;
                      auVar157._4_4_ = auVar157._0_4_;
                      auVar157._8_4_ = auVar157._0_4_;
                      auVar157._12_4_ = auVar157._0_4_;
                      auVar48 = vfmadd231ps_fma(auVar210,auVar157,auVar48);
                      auVar170._0_4_ = local_120 * auVar59._0_4_;
                      auVar170._4_4_ = local_120 * auVar59._4_4_;
                      auVar170._8_4_ = local_120 * auVar59._8_4_;
                      auVar170._12_4_ = local_120 * auVar59._12_4_;
                      auVar50 = vfmadd231ps_fma(auVar170,auVar157,auVar50);
                      auVar171._0_4_ = local_120 * auVar50._0_4_;
                      auVar171._4_4_ = local_120 * auVar50._4_4_;
                      auVar171._8_4_ = local_120 * auVar50._8_4_;
                      auVar171._12_4_ = local_120 * auVar50._12_4_;
                      auVar48 = vfmadd231ps_fma(auVar171,auVar157,auVar48);
                      auVar21._8_4_ = 0x40400000;
                      auVar21._0_8_ = 0x4040000040400000;
                      auVar21._12_4_ = 0x40400000;
                      auVar48 = vmulps_avx512vl(auVar48,auVar21);
                      pGVar9 = (context->scene->geometries).items[uVar40].ptr;
                      if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar35 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar35 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_400 = auVar77;
                        auVar146._0_4_ = fVar214 * (float)local_3c0._0_4_;
                        auVar146._4_4_ = fVar214 * (float)local_3c0._4_4_;
                        auVar146._8_4_ = fVar214 * fStack_3b8;
                        auVar146._12_4_ = fVar214 * fStack_3b4;
                        auVar133._4_4_ = fVar212;
                        auVar133._0_4_ = fVar212;
                        auVar133._8_4_ = fVar212;
                        auVar133._12_4_ = fVar212;
                        auVar50 = vfmadd132ps_fma(auVar133,auVar146,local_3b0);
                        auVar128._4_4_ = fVar201;
                        auVar128._0_4_ = fVar201;
                        auVar128._8_4_ = fVar201;
                        auVar128._12_4_ = fVar201;
                        auVar50 = vfmadd132ps_fma(auVar128,auVar50,local_3a0);
                        auVar119._4_4_ = fVar106;
                        auVar119._0_4_ = fVar106;
                        auVar119._8_4_ = fVar106;
                        auVar119._12_4_ = fVar106;
                        auVar60 = vfmadd132ps_fma(auVar119,auVar50,local_390);
                        auVar50 = vshufps_avx(auVar60,auVar60,0xc9);
                        auVar59 = vshufps_avx(auVar48,auVar48,0xc9);
                        auVar120._0_4_ = auVar60._0_4_ * auVar59._0_4_;
                        auVar120._4_4_ = auVar60._4_4_ * auVar59._4_4_;
                        auVar120._8_4_ = auVar60._8_4_ * auVar59._8_4_;
                        auVar120._12_4_ = auVar60._12_4_ * auVar59._12_4_;
                        auVar48 = vfmsub231ps_fma(auVar120,auVar48,auVar50);
                        auVar136._8_4_ = 1;
                        auVar136._0_8_ = 0x100000001;
                        auVar136._12_4_ = 1;
                        auVar136._16_4_ = 1;
                        auVar136._20_4_ = 1;
                        auVar136._24_4_ = 1;
                        auVar136._28_4_ = 1;
                        local_100 = vpermps_avx2(auVar136,ZEXT1632(auVar46));
                        auVar77 = vpermps_avx2(auVar136,ZEXT1632(auVar48));
                        auVar150._8_4_ = 2;
                        auVar150._0_8_ = 0x200000002;
                        auVar150._12_4_ = 2;
                        auVar150._16_4_ = 2;
                        auVar150._20_4_ = 2;
                        auVar150._24_4_ = 2;
                        auVar150._28_4_ = 2;
                        local_160 = vpermps_avx2(auVar150,ZEXT1632(auVar48));
                        local_140 = auVar48._0_4_;
                        local_180[0] = (RTCHitN)auVar77[0];
                        local_180[1] = (RTCHitN)auVar77[1];
                        local_180[2] = (RTCHitN)auVar77[2];
                        local_180[3] = (RTCHitN)auVar77[3];
                        local_180[4] = (RTCHitN)auVar77[4];
                        local_180[5] = (RTCHitN)auVar77[5];
                        local_180[6] = (RTCHitN)auVar77[6];
                        local_180[7] = (RTCHitN)auVar77[7];
                        local_180[8] = (RTCHitN)auVar77[8];
                        local_180[9] = (RTCHitN)auVar77[9];
                        local_180[10] = (RTCHitN)auVar77[10];
                        local_180[0xb] = (RTCHitN)auVar77[0xb];
                        local_180[0xc] = (RTCHitN)auVar77[0xc];
                        local_180[0xd] = (RTCHitN)auVar77[0xd];
                        local_180[0xe] = (RTCHitN)auVar77[0xe];
                        local_180[0xf] = (RTCHitN)auVar77[0xf];
                        local_180[0x10] = (RTCHitN)auVar77[0x10];
                        local_180[0x11] = (RTCHitN)auVar77[0x11];
                        local_180[0x12] = (RTCHitN)auVar77[0x12];
                        local_180[0x13] = (RTCHitN)auVar77[0x13];
                        local_180[0x14] = (RTCHitN)auVar77[0x14];
                        local_180[0x15] = (RTCHitN)auVar77[0x15];
                        local_180[0x16] = (RTCHitN)auVar77[0x16];
                        local_180[0x17] = (RTCHitN)auVar77[0x17];
                        local_180[0x18] = (RTCHitN)auVar77[0x18];
                        local_180[0x19] = (RTCHitN)auVar77[0x19];
                        local_180[0x1a] = (RTCHitN)auVar77[0x1a];
                        local_180[0x1b] = (RTCHitN)auVar77[0x1b];
                        local_180[0x1c] = (RTCHitN)auVar77[0x1c];
                        local_180[0x1d] = (RTCHitN)auVar77[0x1d];
                        local_180[0x1e] = (RTCHitN)auVar77[0x1e];
                        local_180[0x1f] = (RTCHitN)auVar77[0x1f];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = local_1e0._0_8_;
                        uStack_d8 = local_1e0._8_8_;
                        uStack_d0 = local_1e0._16_8_;
                        uStack_c8 = local_1e0._24_8_;
                        local_c0 = local_200;
                        vpcmpeqd_avx2(local_200,local_200);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = auVar49._0_4_;
                        local_3e0 = local_220;
                        local_430.valid = (int *)local_3e0;
                        local_430.geometryUserPtr = pGVar9->userPtr;
                        local_430.context = context->user;
                        local_430.ray = (RTCRayN *)ray;
                        local_430.hit = local_180;
                        local_430.N = 8;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_430);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar245 = ZEXT1664(auVar46);
                        }
                        if (local_3e0 == (undefined1  [32])0x0) {
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar240 = ZEXT1664(auVar46);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar241 = ZEXT1664(auVar46);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar242 = ZEXT1664(auVar46);
                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar243 = ZEXT3264(auVar77);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar244 = ZEXT1664(auVar46);
                          auVar246 = ZEXT3264(_DAT_01feed20);
                          auVar46 = vxorps_avx512vl(auVar47,auVar47);
                          auVar248 = ZEXT1664(auVar46);
                          auVar247 = ZEXT3264(local_400);
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if (p_Var10 == (RTCFilterFunctionN)0x0) {
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar240 = ZEXT1664(auVar46);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar241 = ZEXT1664(auVar46);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar242 = ZEXT1664(auVar46);
                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar243 = ZEXT3264(auVar77);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar244 = ZEXT1664(auVar46);
                            auVar246 = ZEXT3264(_DAT_01feed20);
                            auVar46 = vxorps_avx512vl(auVar47,auVar47);
                            auVar248 = ZEXT1664(auVar46);
                            auVar247 = ZEXT3264(local_400);
                          }
                          else {
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar240 = ZEXT1664(auVar46);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                            auVar241 = ZEXT1664(auVar46);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar242 = ZEXT1664(auVar46);
                            auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar243 = ZEXT3264(auVar77);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar244 = ZEXT1664(auVar46);
                            auVar246 = ZEXT3264(_DAT_01feed20);
                            auVar46 = vxorps_avx512vl(auVar47,auVar47);
                            auVar248 = ZEXT1664(auVar46);
                            auVar247 = ZEXT3264(local_400);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var10)(&local_430);
                              auVar247 = ZEXT3264(local_400);
                              auVar46 = vxorps_avx512vl(auVar46,auVar46);
                              auVar248 = ZEXT1664(auVar46);
                              auVar246 = ZEXT3264(_DAT_01feed20);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar245 = ZEXT1664(auVar46);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar244 = ZEXT1664(auVar46);
                              auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar243 = ZEXT3264(auVar77);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar242 = ZEXT1664(auVar46);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                              auVar241 = ZEXT1664(auVar46);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar240 = ZEXT1664(auVar46);
                            }
                          }
                          auVar249 = ZEXT464(0x3f800000);
                          uVar39 = vptestmd_avx512vl(local_3e0,local_3e0);
                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar44 = (bool)((byte)uVar39 & 1);
                          bVar45 = (bool)((byte)(uVar39 >> 1) & 1);
                          bVar42 = (bool)((byte)(uVar39 >> 2) & 1);
                          bVar43 = (bool)((byte)(uVar39 >> 3) & 1);
                          bVar13 = (bool)((byte)(uVar39 >> 4) & 1);
                          bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
                          bVar15 = (bool)((byte)(uVar39 >> 6) & 1);
                          bVar16 = SUB81(uVar39 >> 7,0);
                          *(uint *)(local_430.ray + 0x100) =
                               (uint)bVar44 * auVar77._0_4_ |
                               (uint)!bVar44 * *(int *)(local_430.ray + 0x100);
                          *(uint *)(local_430.ray + 0x104) =
                               (uint)bVar45 * auVar77._4_4_ |
                               (uint)!bVar45 * *(int *)(local_430.ray + 0x104);
                          *(uint *)(local_430.ray + 0x108) =
                               (uint)bVar42 * auVar77._8_4_ |
                               (uint)!bVar42 * *(int *)(local_430.ray + 0x108);
                          *(uint *)(local_430.ray + 0x10c) =
                               (uint)bVar43 * auVar77._12_4_ |
                               (uint)!bVar43 * *(int *)(local_430.ray + 0x10c);
                          *(uint *)(local_430.ray + 0x110) =
                               (uint)bVar13 * auVar77._16_4_ |
                               (uint)!bVar13 * *(int *)(local_430.ray + 0x110);
                          *(uint *)(local_430.ray + 0x114) =
                               (uint)bVar14 * auVar77._20_4_ |
                               (uint)!bVar14 * *(int *)(local_430.ray + 0x114);
                          *(uint *)(local_430.ray + 0x118) =
                               (uint)bVar15 * auVar77._24_4_ |
                               (uint)!bVar15 * *(int *)(local_430.ray + 0x118);
                          *(uint *)(local_430.ray + 0x11c) =
                               (uint)bVar16 * auVar77._28_4_ |
                               (uint)!bVar16 * *(int *)(local_430.ray + 0x11c);
                          bVar35 = 1;
                          if (local_3e0 != (undefined1  [32])0x0) goto LAB_01d3b107;
                        }
                        auVar249 = ZEXT464(0x3f800000);
                        *(float *)(ray + k * 4 + 0x100) = fVar211;
                        bVar35 = 0;
                      }
LAB_01d3b107:
                      bVar41 = (bool)(bVar41 | bVar35);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar34 = lVar34 + -1;
      } while (lVar34 != 0);
      goto LAB_01d3a250;
    }
    auVar49 = vinsertps_avx(auVar140,auVar61,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }